

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O3

idx_t duckdb::TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThanNullsFirst>
                (Vector *left,Vector *right,optional_ptr<const_duckdb::SelectionVector,_true> sel,
                idx_t count,optional_ptr<duckdb::SelectionVector,_true> true_sel,
                optional_ptr<duckdb::SelectionVector,_true> false_sel,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  PhysicalType PVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  SelectionVector *pSVar4;
  uint *puVar5;
  short *psVar6;
  ushort *puVar7;
  byte *pbVar8;
  ulong *puVar9;
  data_ptr_t pdVar10;
  sel_t *psVar11;
  data_ptr_t pdVar12;
  sel_t *psVar13;
  sel_t *psVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  element_type *peVar18;
  undefined1 auVar19 [8];
  undefined8 uVar20;
  SelectionVector *pSVar21;
  ulong uVar22;
  _Head_base<0UL,_unsigned_long_*,_false> _Var23;
  Vector *pVVar24;
  element_type *peVar25;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var26;
  reference pvVar27;
  type pVVar28;
  UnifiedVectorFormat *pUVar29;
  optional_ptr<duckdb::SelectionVector,_true> oVar30;
  optional_ptr<const_duckdb::SelectionVector,_true> oVar31;
  TemplatedValidityData<unsigned_long> *pTVar32;
  NotImplementedException *this_01;
  InternalException *this_02;
  ulong uVar33;
  long lVar34;
  idx_t iVar35;
  bool bVar36;
  undefined4 uVar37;
  int iVar38;
  idx_t idx_in_entry;
  idx_t iVar39;
  float *pfVar40;
  double *pdVar41;
  string_t *psVar42;
  uhugeint_t *puVar43;
  interval_t *input_6;
  size_type __n;
  long *plVar44;
  ulong *puVar45;
  sel_t sVar46;
  long lVar47;
  idx_t iVar48;
  idx_t iVar49;
  ulong uVar50;
  idx_t iVar51;
  ulong uVar52;
  long lVar53;
  interval_t *input;
  ulong uVar54;
  long lVar55;
  int iVar56;
  idx_t pos_1;
  int *piVar57;
  optional_ptr<duckdb::ValidityMask,_true> null_mask_00;
  int *piVar58;
  long lVar59;
  idx_t iVar60;
  ulong uVar61;
  ulong uVar62;
  float *pfVar63;
  double *pdVar64;
  string_t *psVar65;
  uhugeint_t *puVar66;
  long lVar67;
  bool bVar68;
  bool bVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  interval_t *input_1;
  UnifiedVectorFormat lvdata;
  UnifiedVectorFormat rvdata;
  SelectionVector slice_sel;
  SelectionVector lcursor;
  SelectionVector maybe_vec;
  SelectionVector rcursor;
  SelectionVector true_sel_2;
  SelectionVector false_sel_1;
  SelectionVector true_sel_1;
  Vector lchild;
  Vector rchild;
  UnifiedVectorFormat rvdata_1;
  OptionalSelection false_opt;
  UnifiedVectorFormat lvdata_1;
  OptionalSelection true_opt;
  SelectionVector false_vec;
  SelectionVector true_vec;
  Vector l_not_null;
  Vector r_not_null;
  SelectionVector *local_4d0;
  idx_t local_4c8;
  long local_4c0;
  optional_ptr<duckdb::ValidityMask,_true> local_4b8;
  optional_ptr<duckdb::ValidityMask,_true> local_4a8;
  long local_4a0;
  undefined1 local_498 [8];
  LogicalType LStack_490;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_478;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_458;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_438;
  undefined1 local_428 [8];
  LogicalType LStack_420;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c8;
  element_type *local_3c0;
  optional_ptr<duckdb::ValidityMask,_true> local_3b8;
  idx_t local_3b0;
  SelectionVector local_3a8;
  SelectionVector local_390;
  SelectionVector local_378;
  SelectionVector local_360;
  undefined1 local_348 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_318;
  SelectionVector local_310;
  Vector local_2f8;
  undefined1 local_288 [8];
  LogicalType aLStack_280 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  optional_ptr<duckdb::SelectionVector,_true> local_218;
  optional_ptr<duckdb::SelectionVector,_true> local_210;
  optional_ptr<const_duckdb::SelectionVector,_true> local_208;
  UnifiedVectorFormat local_200;
  OptionalSelection local_1b8;
  UnifiedVectorFormat local_198;
  OptionalSelection local_150;
  SelectionVector local_130;
  SelectionVector local_118;
  Vector local_100;
  Vector local_98;
  
  PVar1 = (left->type).physical_type_;
  local_4d0 = sel.ptr;
  if (199 < PVar1) {
    if (PVar1 != VARCHAR) {
      if (PVar1 == UINT128) {
        local_288 = (undefined1  [8])null_mask.ptr;
        if (sel.ptr == (SelectionVector *)0x0) {
          local_4d0 = FlatVector::IncrementalSelectionVector();
        }
        if (null_mask.ptr != (ValidityMask *)0x0) {
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
          UpdateNullMask(left,local_4d0,count,(ValidityMask *)local_288);
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
          UpdateNullMask(right,local_4d0,count,(ValidityMask *)local_288);
        }
        if (left->vector_type == FLAT_VECTOR) {
          if (right->vector_type == FLAT_VECTOR) {
            puVar43 = (uhugeint_t *)left->data;
            puVar66 = (uhugeint_t *)right->data;
            FlatVector::VerifyFlatVector(left);
            FlatVector::VerifyFlatVector(right);
            if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return 0;
              }
              lVar47 = 0;
              local_4c8 = 0;
              uVar50 = 0;
              do {
                uVar33 = uVar50;
                if (local_4d0->sel_vector != (sel_t *)0x0) {
                  uVar33 = (ulong)local_4d0->sel_vector[uVar50];
                }
                puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
                }
                puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                bVar36 = (bool)(bVar68 ^ 1);
                if (!bVar69 && bVar36 == false) {
                  bVar68 = uhugeint_t::operator>(puVar43,puVar66);
                  bVar36 = !bVar68;
                }
                (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
                local_4c8 = local_4c8 + bVar68;
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)bVar36;
                uVar50 = uVar50 + 1;
                puVar43 = puVar43 + 1;
                puVar66 = puVar66 + 1;
              } while (count != uVar50);
              return local_4c8;
            }
            if (true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return 0;
              }
              uVar50 = 0;
              local_4c8 = 0;
              do {
                uVar33 = uVar50;
                if (local_4d0->sel_vector != (sel_t *)0x0) {
                  uVar33 = (ulong)local_4d0->sel_vector[uVar50];
                }
                puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
                }
                puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  bVar68 = uhugeint_t::operator>(puVar43,puVar66);
                }
                (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
                local_4c8 = local_4c8 + bVar68;
                uVar50 = uVar50 + 1;
                puVar43 = puVar43 + 1;
                puVar66 = puVar66 + 1;
              } while (count != uVar50);
              return local_4c8;
            }
            if (count != 0) {
              lVar47 = 0;
              uVar50 = 0;
              do {
                uVar33 = uVar50;
                if (local_4d0->sel_vector != (sel_t *)0x0) {
                  uVar33 = (ulong)local_4d0->sel_vector[uVar50];
                }
                puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar68 = false;
                }
                else {
                  bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if (!bVar69 && bVar68 == false) {
                  bVar68 = uhugeint_t::operator>(puVar43,puVar66);
                  bVar68 = !bVar68;
                }
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)bVar68;
                uVar50 = uVar50 + 1;
                puVar43 = puVar43 + 1;
                puVar66 = puVar66 + 1;
              } while (count != uVar50);
              goto LAB_0162bf1b;
            }
            goto LAB_0162bf18;
          }
          if (right->vector_type == CONSTANT_VECTOR) {
            puVar43 = (uhugeint_t *)right->data;
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar66 = (uhugeint_t *)left->data;
            _local_498 = (undefined1  [16])0x0;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
            if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
              local_2f8._0_8_ = 0x800;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_428,(unsigned_long *)&local_2f8);
              peVar18 = LStack_490.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              auVar19 = local_428;
              LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)LStack_420._0_8_;
              _local_428 = (undefined1  [16])0x0;
              auVar16 = _local_428;
              local_428[0] = auVar19[0];
              local_428[1] = auVar19[1];
              local_428._2_6_ = auVar19._2_6_;
              LStack_490.id_ = local_428[0];
              LStack_490.physical_type_ = local_428[1];
              LStack_490._2_6_ = local_428._2_6_;
              _local_428 = auVar16;
              if (peVar18 != (element_type *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
                }
              }
              pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(local_498 + 8));
              local_498 = *(undefined1 (*) [8])
                           &(pTVar32->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                            .super__Head_base<0UL,_unsigned_long_*,_false>;
              *(undefined8 *)local_498 = 0xfffffffffffffffe;
            }
            FlatVector::VerifyFlatVector(left);
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_0162ce34;
                lVar47 = 0;
                uVar50 = 0;
                do {
                  uVar33 = uVar50;
                  if (local_4d0->sel_vector != (sel_t *)0x0) {
                    uVar33 = (ulong)local_4d0->sel_vector[uVar50];
                  }
                  puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                  ;
                  if (puVar2 == (unsigned_long *)0x0) {
                    bVar68 = false;
                  }
                  else {
                    bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                  }
                  if (local_498 == (undefined1  [8])0x0) {
                    bVar69 = false;
                  }
                  else {
                    bVar69 = (*(byte *)local_498 & 1) == 0;
                  }
                  if (!bVar69 && bVar68 == false) {
                    bVar68 = uhugeint_t::operator>(puVar66,puVar43);
                    bVar68 = !bVar68;
                  }
                  (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
                  lVar47 = lVar47 + (ulong)bVar68;
                  uVar50 = uVar50 + 1;
                  puVar66 = puVar66 + 1;
                } while (count != uVar50);
                goto LAB_0162ce37;
              }
              if (count != 0) {
                uVar50 = 0;
                local_4c8 = 0;
                do {
                  uVar33 = uVar50;
                  if (local_4d0->sel_vector != (sel_t *)0x0) {
                    uVar33 = (ulong)local_4d0->sel_vector[uVar50];
                  }
                  puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                  ;
                  if (puVar2 == (unsigned_long *)0x0) {
                    bVar68 = true;
                  }
                  else {
                    bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
                  }
                  if (local_498 == (undefined1  [8])0x0) {
                    bVar69 = false;
                  }
                  else {
                    bVar69 = (*(byte *)local_498 & 1) == 0;
                  }
                  if (bVar68 == true && !bVar69) {
                    bVar68 = uhugeint_t::operator>(puVar66,puVar43);
                  }
                  (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
                  local_4c8 = local_4c8 + bVar68;
                  uVar50 = uVar50 + 1;
                  puVar66 = puVar66 + 1;
                  local_478._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       LStack_490.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                } while (count != uVar50);
                goto LAB_0162d073;
              }
            }
            else if (count != 0) {
              lVar47 = 0;
              local_4c8 = 0;
              uVar50 = 0;
              do {
                uVar33 = uVar50;
                if (local_4d0->sel_vector != (sel_t *)0x0) {
                  uVar33 = (ulong)local_4d0->sel_vector[uVar50];
                }
                puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (*(byte *)local_498 & 1) == 0;
                }
                bVar36 = (bool)(bVar68 ^ 1);
                if (!bVar69 && bVar36 == false) {
                  bVar68 = uhugeint_t::operator>(puVar66,puVar43);
                  bVar36 = !bVar68;
                }
                (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
                local_4c8 = local_4c8 + bVar68;
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)bVar36;
                uVar50 = uVar50 + 1;
                puVar66 = puVar66 + 1;
                local_478._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     LStack_490.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              } while (count != uVar50);
              goto LAB_0162d073;
            }
            goto LAB_0162962c;
          }
        }
        else if (left->vector_type == CONSTANT_VECTOR) {
          if (right->vector_type == FLAT_VECTOR) {
            puVar43 = (uhugeint_t *)left->data;
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar66 = (uhugeint_t *)right->data;
            _local_498 = (undefined1  [16])0x0;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
            if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
              local_2f8._0_8_ = 0x800;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_428,(unsigned_long *)&local_2f8);
              peVar18 = LStack_490.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              auVar19 = local_428;
              LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)LStack_420._0_8_;
              _local_428 = (undefined1  [16])0x0;
              auVar16 = _local_428;
              local_428[0] = auVar19[0];
              local_428[1] = auVar19[1];
              local_428._2_6_ = auVar19._2_6_;
              LStack_490.id_ = local_428[0];
              LStack_490.physical_type_ = local_428[1];
              LStack_490._2_6_ = local_428._2_6_;
              _local_428 = auVar16;
              if (peVar18 != (element_type *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
                }
              }
              pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(local_498 + 8));
              local_498 = *(undefined1 (*) [8])
                           &(pTVar32->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                            .super__Head_base<0UL,_unsigned_long_*,_false>;
              *(undefined8 *)local_498 = 0xfffffffffffffffe;
            }
            FlatVector::VerifyFlatVector(right);
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_0162cec8;
                lVar47 = 0;
                uVar50 = 0;
                do {
                  uVar33 = uVar50;
                  if (local_4d0->sel_vector != (sel_t *)0x0) {
                    uVar33 = (ulong)local_4d0->sel_vector[uVar50];
                  }
                  if (local_498 == (undefined1  [8])0x0) {
                    bVar68 = false;
                  }
                  else {
                    bVar68 = (*(byte *)local_498 & 1) == 0;
                  }
                  puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_mask;
                  if (puVar2 == (unsigned_long *)0x0) {
                    bVar69 = false;
                  }
                  else {
                    bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                  }
                  if (!bVar69 && bVar68 == false) {
                    bVar68 = uhugeint_t::operator>(puVar43,puVar66);
                    bVar68 = !bVar68;
                  }
                  (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
                  lVar47 = lVar47 + (ulong)bVar68;
                  uVar50 = uVar50 + 1;
                  puVar66 = puVar66 + 1;
                } while (count != uVar50);
                goto LAB_0162cecb;
              }
              if (count != 0) {
                uVar50 = 0;
                local_4c8 = 0;
                do {
                  uVar33 = uVar50;
                  if (local_4d0->sel_vector != (sel_t *)0x0) {
                    uVar33 = (ulong)local_4d0->sel_vector[uVar50];
                  }
                  if (local_498 == (undefined1  [8])0x0) {
                    bVar68 = true;
                  }
                  else {
                    bVar68 = (bool)(*(byte *)local_498 & 1);
                  }
                  puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_mask;
                  if (puVar2 == (unsigned_long *)0x0) {
                    bVar69 = false;
                  }
                  else {
                    bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                  }
                  if (bVar68 == true && !bVar69) {
                    bVar68 = uhugeint_t::operator>(puVar43,puVar66);
                  }
                  (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
                  local_4c8 = local_4c8 + bVar68;
                  uVar50 = uVar50 + 1;
                  puVar66 = puVar66 + 1;
                  local_478._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       LStack_490.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                } while (count != uVar50);
                goto LAB_0162d073;
              }
            }
            else if (count != 0) {
              lVar47 = 0;
              local_4c8 = 0;
              uVar50 = 0;
              do {
                uVar33 = uVar50;
                if (local_4d0->sel_vector != (sel_t *)0x0) {
                  uVar33 = (ulong)local_4d0->sel_vector[uVar50];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (bool)(*(byte *)local_498 & 1);
                }
                puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                bVar36 = (bool)(bVar68 ^ 1);
                if (!bVar69 && bVar36 == false) {
                  bVar68 = uhugeint_t::operator>(puVar43,puVar66);
                  bVar36 = !bVar68;
                }
                (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
                local_4c8 = local_4c8 + bVar68;
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)bVar36;
                uVar50 = uVar50 + 1;
                puVar66 = puVar66 + 1;
                local_478._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     LStack_490.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              } while (count != uVar50);
              goto LAB_0162d073;
            }
            goto LAB_0162962c;
          }
          if (right->vector_type == CONSTANT_VECTOR) {
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (*puVar2 & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*puVar3 & 1) == 0;
            }
            if ((bool)(bVar69 | bVar68)) {
              if (!bVar68) {
LAB_0162b3df:
                if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
                  psVar13 = local_4d0->sel_vector;
                  psVar14 = (true_sel.ptr)->sel_vector;
                  iVar35 = 0;
                  do {
                    sVar46 = (sel_t)iVar35;
                    if (psVar13 != (sel_t *)0x0) {
                      sVar46 = psVar13[iVar35];
                    }
                    psVar14[iVar35] = sVar46;
                    iVar35 = iVar35 + 1;
                  } while (count != iVar35);
                  return count;
                }
                return count;
              }
            }
            else {
              bVar68 = uhugeint_t::operator>((uhugeint_t *)left->data,(uhugeint_t *)right->data);
              if (bVar68) goto LAB_0162b3df;
            }
            if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            iVar35 = 0;
            do {
              sVar46 = (sel_t)iVar35;
              if (psVar13 != (sel_t *)0x0) {
                sVar46 = psVar13[iVar35];
              }
              psVar14[iVar35] = sVar46;
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            return 0;
          }
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        uVar17 = LStack_490._0_8_;
        uVar20 = LStack_420._0_8_;
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count != 0) {
                psVar13 = local_4d0->sel_vector;
                lVar47 = *(long *)local_498;
                psVar14 = *(sel_t **)local_428;
                lVar34 = 0;
                iVar35 = 0;
                do {
                  iVar60 = iVar35;
                  if (psVar13 != (sel_t *)0x0) {
                    iVar60 = (idx_t)psVar13[iVar35];
                  }
                  iVar49 = iVar35;
                  if (lVar47 != 0) {
                    iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
                  }
                  iVar48 = iVar35;
                  if (psVar14 != (sel_t *)0x0) {
                    iVar48 = (idx_t)psVar14[iVar35];
                  }
                  bVar68 = uhugeint_t::operator>
                                     ((uhugeint_t *)(uVar17 + iVar49 * 0x10),
                                      (uhugeint_t *)(uVar20 + iVar48 * 0x10));
                  if (!bVar68) {
                    (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
                    lVar34 = lVar34 + 1;
                  }
                  iVar35 = iVar35 + 1;
                } while (count != iVar35);
                goto LAB_0162a884;
              }
              goto LAB_0162a882;
            }
            if (count == 0) goto LAB_0162536b;
            psVar13 = local_4d0->sel_vector;
            lVar47 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            iVar35 = 0;
            local_4c8 = 0;
            do {
              iVar60 = iVar35;
              if (psVar13 != (sel_t *)0x0) {
                iVar60 = (idx_t)psVar13[iVar35];
              }
              iVar49 = iVar35;
              if (lVar47 != 0) {
                iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
              }
              iVar48 = iVar35;
              if (psVar14 != (sel_t *)0x0) {
                iVar48 = (idx_t)psVar14[iVar35];
              }
              bVar68 = uhugeint_t::operator>
                                 ((uhugeint_t *)(uVar17 + iVar49 * 0x10),
                                  (uhugeint_t *)(uVar20 + iVar48 * 0x10));
              if (bVar68) {
                (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
                local_4c8 = local_4c8 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
          }
          else {
            if (count == 0) goto LAB_0162536b;
            psVar13 = local_4d0->sel_vector;
            lVar47 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            local_4c8 = 0;
            iVar60 = 0;
            iVar35 = 0;
            do {
              iVar49 = iVar60;
              if (psVar13 != (sel_t *)0x0) {
                iVar49 = (idx_t)psVar13[iVar60];
              }
              iVar48 = iVar60;
              if (lVar47 != 0) {
                iVar48 = (idx_t)*(uint *)(lVar47 + iVar60 * 4);
              }
              iVar51 = iVar60;
              if (psVar14 != (sel_t *)0x0) {
                iVar51 = (idx_t)psVar14[iVar60];
              }
              bVar68 = uhugeint_t::operator>
                                 ((uhugeint_t *)(uVar17 + iVar48 * 0x10),
                                  (uhugeint_t *)(uVar20 + iVar51 * 0x10));
              if (bVar68) {
                iVar48 = local_4c8;
                oVar30.ptr = true_sel.ptr;
                iVar51 = iVar35;
                local_4c8 = local_4c8 + 1;
              }
              else {
                iVar51 = iVar35 + 1;
                iVar48 = iVar35;
                oVar30.ptr = false_sel.ptr;
              }
              (oVar30.ptr)->sel_vector[iVar48] = (sel_t)iVar49;
              iVar60 = iVar60 + 1;
              iVar35 = iVar51;
            } while (count != iVar60);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162a882;
            psVar13 = local_4d0->sel_vector;
            lVar47 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            lVar34 = 0;
            iVar35 = 0;
            do {
              iVar60 = iVar35;
              if (psVar13 != (sel_t *)0x0) {
                iVar60 = (idx_t)psVar13[iVar35];
              }
              iVar49 = iVar35;
              if (lVar47 != 0) {
                iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
              }
              iVar48 = iVar35;
              if (psVar14 != (sel_t *)0x0) {
                iVar48 = (idx_t)psVar14[iVar35];
              }
              if (LStack_490.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = uhugeint_t::operator>
                                   ((uhugeint_t *)(uVar17 + iVar49 * 0x10),
                                    (uhugeint_t *)(uVar20 + iVar48 * 0x10));
              }
              if (bVar68 == false) {
                (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
                lVar34 = lVar34 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            goto LAB_0162a884;
          }
          if (count == 0) goto LAB_0162536b;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          iVar35 = 0;
          local_4c8 = 0;
          do {
            iVar60 = iVar35;
            if (psVar13 != (sel_t *)0x0) {
              iVar60 = (idx_t)psVar13[iVar35];
            }
            iVar49 = iVar35;
            if (lVar47 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
            }
            iVar48 = iVar35;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar35];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = uhugeint_t::operator>
                                 ((uhugeint_t *)(uVar17 + iVar49 * 0x10),
                                  (uhugeint_t *)(uVar20 + iVar48 * 0x10));
            }
            if (bVar68 != false) {
              (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
              local_4c8 = local_4c8 + 1;
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        else {
          if (count == 0) goto LAB_0162536b;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          local_4c8 = 0;
          iVar60 = 0;
          iVar35 = 0;
          do {
            iVar49 = iVar60;
            if (psVar13 != (sel_t *)0x0) {
              iVar49 = (idx_t)psVar13[iVar60];
            }
            iVar48 = iVar60;
            if (lVar47 != 0) {
              iVar48 = (idx_t)*(uint *)(lVar47 + iVar60 * 4);
            }
            iVar51 = iVar60;
            if (psVar14 != (sel_t *)0x0) {
              iVar51 = (idx_t)psVar14[iVar60];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar48 >> 6) * 8) >> (iVar48 & 0x3f) & 1) != 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar51 >> 6] >> (iVar51 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = uhugeint_t::operator>
                                 ((uhugeint_t *)(uVar17 + iVar48 * 0x10),
                                  (uhugeint_t *)(uVar20 + iVar51 * 0x10));
            }
            if (bVar68 == false) {
              iVar51 = iVar35 + 1;
              iVar48 = iVar35;
              oVar30.ptr = false_sel.ptr;
            }
            else {
              iVar48 = local_4c8;
              oVar30.ptr = true_sel.ptr;
              iVar51 = iVar35;
              local_4c8 = local_4c8 + 1;
            }
            (oVar30.ptr)->sel_vector[iVar48] = (sel_t)iVar49;
            iVar60 = iVar60 + 1;
            iVar35 = iVar51;
          } while (count != iVar60);
        }
        goto LAB_0162a891;
      }
      if (PVar1 != INT128) goto switchD_0161deea_caseD_a;
      local_288 = (undefined1  [8])null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        local_4d0 = FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
        UpdateNullMask(left,local_4d0,count,(ValidityMask *)local_288);
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
        UpdateNullMask(right,local_4d0,count,(ValidityMask *)local_288);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          pdVar10 = left->data;
          pdVar12 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return 0;
            }
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar47 = 8;
            lVar34 = 0;
            iVar35 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (puVar3 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              bVar36 = (bool)(bVar68 ^ 1);
              if (!bVar69 && bVar36 == false) {
                lVar53 = *(long *)(pdVar10 + lVar47);
                lVar55 = *(long *)(pdVar12 + lVar47);
                bVar69 = lVar53 == lVar55;
                bVar68 = *(ulong *)(pdVar12 + lVar47 + -8) < *(ulong *)(pdVar10 + lVar47 + -8) &&
                         bVar69 || !bVar69 && lVar55 <= lVar53;
                bVar36 = (*(ulong *)(pdVar10 + lVar47 + -8) <= *(ulong *)(pdVar12 + lVar47 + -8) ||
                         !bVar69) && (bVar69 || lVar55 > lVar53);
              }
              psVar14[iVar35] = (sel_t)uVar33;
              iVar35 = iVar35 + bVar68;
              psVar11[lVar34] = (sel_t)uVar33;
              lVar34 = lVar34 + (ulong)bVar36;
              uVar50 = uVar50 + 1;
              lVar47 = lVar47 + 0x10;
            } while (count != uVar50);
            return iVar35;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return 0;
            }
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            lVar47 = 8;
            uVar50 = 0;
            iVar35 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (puVar3 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                lVar34 = *(long *)(pdVar10 + lVar47);
                lVar53 = *(long *)(pdVar12 + lVar47);
                bVar68 = *(ulong *)(pdVar12 + lVar47 + -8) < *(ulong *)(pdVar10 + lVar47 + -8) &&
                         lVar34 == lVar53 || lVar34 != lVar53 && lVar53 <= lVar34;
              }
              psVar14[iVar35] = (sel_t)uVar33;
              iVar35 = iVar35 + bVar68;
              uVar50 = uVar50 + 1;
              lVar47 = lVar47 + 0x10;
            } while (count != uVar50);
            return iVar35;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar34 = 8;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (puVar3 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = (*(ulong *)(pdVar10 + lVar34 + -8) <= *(ulong *)(pdVar12 + lVar34 + -8) ||
                         *(long *)(pdVar10 + lVar34) != *(long *)(pdVar12 + lVar34)) &&
                         *(long *)(pdVar10 + lVar34) <= *(long *)(pdVar12 + lVar34);
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
              lVar34 = lVar34 + 0x10;
            } while (count != uVar50);
            goto LAB_0162bfde;
          }
          goto LAB_0162bfdc;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar9 = (ulong *)right->data;
          puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          pdVar10 = left->data;
          _local_498 = (undefined1  [16])0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
            local_2f8._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_428,(unsigned_long *)&local_2f8);
            peVar18 = LStack_490.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar19 = local_428;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_420._0_8_;
            _local_428 = (undefined1  [16])0x0;
            auVar16 = _local_428;
            local_428[0] = auVar19[0];
            local_428[1] = auVar19[1];
            local_428._2_6_ = auVar19._2_6_;
            LStack_490.id_ = local_428[0];
            LStack_490.physical_type_ = local_428[1];
            LStack_490._2_6_ = local_428._2_6_;
            _local_428 = auVar16;
            if (peVar18 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
              }
            }
            pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_498 + 8));
            local_498 = *(undefined1 (*) [8])
                         &(pTVar32->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false>;
            *(undefined8 *)local_498 = 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(left);
          puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_490.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_0162d010;
              psVar13 = local_4d0->sel_vector;
              psVar14 = (false_sel.ptr)->sel_vector;
              puVar45 = (ulong *)(pdVar10 + 8);
              lVar47 = 0;
              uVar50 = 0;
              do {
                uVar33 = uVar50;
                if (psVar13 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar13[uVar50];
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar68 = false;
                }
                else {
                  bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (*(byte *)local_498 & 1) == 0;
                }
                if (!bVar69 && bVar68 == false) {
                  bVar68 = (puVar45[-1] <= *puVar9 || *puVar45 != puVar9[1]) &&
                           (long)*puVar45 <= (long)puVar9[1];
                }
                psVar14[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)bVar68;
                uVar50 = uVar50 + 1;
                puVar45 = puVar45 + 2;
              } while (count != uVar50);
              goto LAB_0162d012;
            }
            if (count != 0) {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (true_sel.ptr)->sel_vector;
              puVar45 = (ulong *)(pdVar10 + 8);
              uVar50 = 0;
              local_4c8 = 0;
              do {
                uVar33 = uVar50;
                if (psVar13 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar13[uVar50];
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (*(byte *)local_498 & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  uVar62 = *puVar45;
                  uVar61 = puVar9[1];
                  bVar68 = *puVar9 < puVar45[-1] && uVar62 == uVar61 ||
                           uVar62 != uVar61 && (long)uVar61 <= (long)uVar62;
                }
                psVar14[local_4c8] = (sel_t)uVar33;
                local_4c8 = local_4c8 + bVar68;
                uVar50 = uVar50 + 1;
                puVar45 = puVar45 + 2;
              } while (count != uVar50);
              goto LAB_0162d022;
            }
          }
          else if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            puVar45 = (ulong *)(pdVar10 + 8);
            lVar47 = 0;
            local_4c8 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              bVar36 = (bool)(bVar68 ^ 1);
              if (!bVar69 && bVar36 == false) {
                uVar62 = *puVar45;
                uVar61 = puVar9[1];
                bVar69 = uVar62 == uVar61;
                bVar68 = *puVar9 < puVar45[-1] && bVar69 || !bVar69 && (long)uVar61 <= (long)uVar62;
                bVar36 = (puVar45[-1] <= *puVar9 || !bVar69) &&
                         (bVar69 || (long)uVar61 > (long)uVar62);
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              psVar11[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar36;
              uVar50 = uVar50 + 1;
              puVar45 = puVar45 + 2;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
          goto LAB_01629797;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          puVar9 = (ulong *)left->data;
          puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          pdVar10 = right->data;
          _local_498 = (undefined1  [16])0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
            local_2f8._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_428,(unsigned_long *)&local_2f8);
            peVar18 = LStack_490.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar19 = local_428;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_420._0_8_;
            _local_428 = (undefined1  [16])0x0;
            auVar16 = _local_428;
            local_428[0] = auVar19[0];
            local_428[1] = auVar19[1];
            local_428._2_6_ = auVar19._2_6_;
            LStack_490.id_ = local_428[0];
            LStack_490.physical_type_ = local_428[1];
            LStack_490._2_6_ = local_428._2_6_;
            _local_428 = auVar16;
            if (peVar18 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
              }
            }
            pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_498 + 8));
            local_498 = *(undefined1 (*) [8])
                         &(pTVar32->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false>;
            *(undefined8 *)local_498 = 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(right);
          puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_490.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_0162d010;
              psVar13 = local_4d0->sel_vector;
              psVar14 = (false_sel.ptr)->sel_vector;
              puVar45 = (ulong *)(pdVar10 + 8);
              lVar47 = 0;
              uVar50 = 0;
              do {
                uVar33 = uVar50;
                if (psVar13 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar13[uVar50];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar68 = false;
                }
                else {
                  bVar68 = (*(byte *)local_498 & 1) == 0;
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if (!bVar69 && bVar68 == false) {
                  bVar68 = (*puVar9 <= puVar45[-1] || puVar9[1] != *puVar45) &&
                           (long)puVar9[1] <= (long)*puVar45;
                }
                psVar14[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)bVar68;
                uVar50 = uVar50 + 1;
                puVar45 = puVar45 + 2;
              } while (count != uVar50);
              goto LAB_0162d012;
            }
            if (count != 0) {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (true_sel.ptr)->sel_vector;
              puVar45 = (ulong *)(pdVar10 + 8);
              uVar50 = 0;
              local_4c8 = 0;
              do {
                uVar33 = uVar50;
                if (psVar13 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar13[uVar50];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (bool)(*(byte *)local_498 & 1);
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  uVar62 = puVar9[1];
                  uVar61 = *puVar45;
                  bVar68 = puVar45[-1] < *puVar9 && uVar62 == uVar61 ||
                           uVar62 != uVar61 && (long)uVar61 <= (long)uVar62;
                }
                psVar14[local_4c8] = (sel_t)uVar33;
                local_4c8 = local_4c8 + bVar68;
                uVar50 = uVar50 + 1;
                puVar45 = puVar45 + 2;
              } while (count != uVar50);
              goto LAB_0162d022;
            }
          }
          else if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            puVar45 = (ulong *)(pdVar10 + 8);
            lVar47 = 0;
            local_4c8 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              bVar36 = (bool)(bVar68 ^ 1);
              if (!bVar69 && bVar36 == false) {
                uVar62 = puVar9[1];
                uVar61 = *puVar45;
                bVar69 = uVar62 == uVar61;
                bVar68 = puVar45[-1] < *puVar9 && bVar69 || !bVar69 && (long)uVar61 <= (long)uVar62;
                bVar36 = (*puVar9 <= puVar45[-1] || !bVar69) &&
                         (bVar69 || (long)uVar61 > (long)uVar62);
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              psVar11[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar36;
              uVar50 = uVar50 + 1;
              puVar45 = puVar45 + 2;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
          goto LAB_01629797;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar2 == (unsigned_long *)0x0) {
            bVar68 = false;
          }
          else {
            bVar68 = (*puVar2 & 1) == 0;
          }
          if (puVar3 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (*puVar3 & 1) == 0;
          }
          if ((bool)(bVar69 | bVar68)) {
            if (!bVar68) {
LAB_0162b523:
              if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
                psVar13 = local_4d0->sel_vector;
                psVar14 = (true_sel.ptr)->sel_vector;
                iVar35 = 0;
                do {
                  sVar46 = (sel_t)iVar35;
                  if (psVar13 != (sel_t *)0x0) {
                    sVar46 = psVar13[iVar35];
                  }
                  psVar14[iVar35] = sVar46;
                  iVar35 = iVar35 + 1;
                } while (count != iVar35);
                return count;
              }
              return count;
            }
          }
          else {
            uVar50 = *(ulong *)((long)left->data + 8);
            uVar33 = *(ulong *)((long)right->data + 8);
            if (((long)uVar33 < (long)uVar50) ||
               (*(ulong *)right->data < *(ulong *)left->data && uVar50 == uVar33))
            goto LAB_0162b523;
          }
          if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (false_sel.ptr)->sel_vector;
          iVar35 = 0;
          do {
            sVar46 = (sel_t)iVar35;
            if (psVar13 != (sel_t *)0x0) {
              sVar46 = psVar13[iVar35];
            }
            psVar14[iVar35] = sVar46;
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
          return 0;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
      Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
      Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
      if (LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0 &&
          LStack_420.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0162550d;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          iVar49 = 0;
          iVar35 = 0;
          iVar60 = 0;
          do {
            iVar48 = iVar49;
            if (psVar13 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar13[iVar49];
            }
            iVar51 = iVar49;
            if (lVar47 != 0) {
              iVar51 = (idx_t)*(uint *)(lVar47 + iVar49 * 4);
            }
            iVar39 = iVar49;
            if (psVar14 != (sel_t *)0x0) {
              iVar39 = (idx_t)psVar14[iVar49];
            }
            if ((*(long *)(LStack_420._0_8_ + iVar39 * 0x10 + 8) <
                 *(long *)(LStack_490._0_8_ + (iVar51 * 2 + 1) * 8)) ||
               (*(ulong *)(LStack_420._0_8_ + iVar39 * 0x10) <
                *(ulong *)(LStack_490._0_8_ + iVar51 * 0x10) &&
                *(long *)(LStack_490._0_8_ + (iVar51 * 2 + 1) * 8) ==
                *(long *)(LStack_420._0_8_ + iVar39 * 0x10 + 8))) {
              local_4c8 = iVar60 + 1;
              oVar30.ptr = true_sel.ptr;
              iVar51 = iVar35;
              iVar35 = iVar60;
            }
            else {
              oVar30.ptr = false_sel.ptr;
              iVar51 = iVar35 + 1;
              local_4c8 = iVar60;
            }
            (oVar30.ptr)->sel_vector[iVar35] = (sel_t)iVar48;
            iVar49 = iVar49 + 1;
            iVar35 = iVar51;
            iVar60 = local_4c8;
          } while (count != iVar49);
        }
        else {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162a963;
            psVar13 = local_4d0->sel_vector;
            lVar47 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            lVar34 = 0;
            iVar35 = 0;
            do {
              iVar60 = iVar35;
              if (psVar13 != (sel_t *)0x0) {
                iVar60 = (idx_t)psVar13[iVar35];
              }
              iVar49 = iVar35;
              if (lVar47 != 0) {
                iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
              }
              iVar48 = iVar35;
              if (psVar14 != (sel_t *)0x0) {
                iVar48 = (idx_t)psVar14[iVar35];
              }
              if ((*(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8) <=
                   *(long *)(LStack_420._0_8_ + iVar48 * 0x10 + 8)) &&
                 (*(ulong *)(LStack_490._0_8_ + iVar49 * 0x10) <=
                  *(ulong *)(LStack_420._0_8_ + iVar48 * 0x10) ||
                  *(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8) !=
                  *(long *)(LStack_420._0_8_ + iVar48 * 0x10 + 8))) {
                (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
                lVar34 = lVar34 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            goto LAB_0162aa64;
          }
          if (count == 0) goto LAB_0162550d;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          iVar35 = 0;
          local_4c8 = 0;
          do {
            iVar60 = iVar35;
            if (psVar13 != (sel_t *)0x0) {
              iVar60 = (idx_t)psVar13[iVar35];
            }
            iVar49 = iVar35;
            if (lVar47 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
            }
            iVar48 = iVar35;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar35];
            }
            if ((*(long *)(LStack_420._0_8_ + iVar48 * 0x10 + 8) <
                 *(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8)) ||
               (*(ulong *)(LStack_420._0_8_ + iVar48 * 0x10) <
                *(ulong *)(LStack_490._0_8_ + iVar49 * 0x10) &&
                *(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8) ==
                *(long *)(LStack_420._0_8_ + iVar48 * 0x10 + 8))) {
              (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
              local_4c8 = local_4c8 + 1;
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
      }
      else if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        iVar49 = 0;
        iVar35 = 0;
        iVar60 = 0;
        do {
          iVar48 = iVar49;
          if (psVar13 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar13[iVar49];
          }
          iVar51 = iVar49;
          if (lVar47 != 0) {
            iVar51 = (idx_t)*(uint *)(lVar47 + iVar49 * 4);
          }
          iVar39 = iVar49;
          if (psVar14 != (sel_t *)0x0) {
            iVar39 = (idx_t)psVar14[iVar49];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar51 >> 6) * 8) >> (iVar51 & 0x3f) & 1) != 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar39 >> 6] >> (iVar39 & 0x3f) & 1)
                     == 0;
          }
          if (bVar68 && !bVar69) {
            uVar50 = ((ulong *)(LStack_490._0_8_ + iVar51 * 0x10))[1];
            uVar33 = ((ulong *)(LStack_420._0_8_ + iVar39 * 0x10))[1];
            if (((long)uVar33 < (long)uVar50) ||
               (*(ulong *)(LStack_420._0_8_ + iVar39 * 0x10) <
                *(ulong *)(LStack_490._0_8_ + iVar51 * 0x10) && uVar50 == uVar33))
            goto LAB_01622dd6;
LAB_01622dce:
            iVar51 = iVar35 + 1;
            local_4c8 = iVar60;
            oVar30.ptr = false_sel.ptr;
          }
          else {
            if (!bVar68) goto LAB_01622dce;
LAB_01622dd6:
            iVar51 = iVar35;
            local_4c8 = iVar60 + 1;
            iVar35 = iVar60;
            oVar30.ptr = true_sel.ptr;
          }
          (oVar30.ptr)->sel_vector[iVar35] = (sel_t)iVar48;
          iVar49 = iVar49 + 1;
          iVar35 = iVar51;
          iVar60 = local_4c8;
        } while (count != iVar49);
      }
      else {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            lVar47 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            lVar34 = 0;
            iVar35 = 0;
            do {
              iVar60 = iVar35;
              if (psVar13 != (sel_t *)0x0) {
                iVar60 = (idx_t)psVar13[iVar35];
              }
              iVar49 = iVar35;
              if (lVar47 != 0) {
                iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
              }
              iVar48 = iVar35;
              if (psVar14 != (sel_t *)0x0) {
                iVar48 = (idx_t)psVar14[iVar35];
              }
              if (LStack_490.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) &
                         1) == 0;
              }
              if (bVar68 && !bVar69) {
                uVar50 = ((ulong *)(LStack_490._0_8_ + iVar49 * 0x10))[1];
                uVar33 = ((ulong *)(LStack_420._0_8_ + iVar48 * 0x10))[1];
                if (((long)uVar50 <= (long)uVar33) &&
                   (*(ulong *)(LStack_490._0_8_ + iVar49 * 0x10) <=
                    *(ulong *)(LStack_420._0_8_ + iVar48 * 0x10) || uVar50 != uVar33))
                goto LAB_0162aa39;
              }
              else if (!bVar68) {
LAB_0162aa39:
                (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
                lVar34 = lVar34 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            goto LAB_0162aa64;
          }
          goto LAB_0162aa5a;
        }
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        iVar35 = 0;
        local_4c8 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1)
                     == 0;
          }
          if (bVar68 && !bVar69) {
            uVar50 = ((ulong *)(LStack_490._0_8_ + iVar49 * 0x10))[1];
            uVar33 = ((ulong *)(LStack_420._0_8_ + iVar48 * 0x10))[1];
            if (((long)uVar33 < (long)uVar50) ||
               (*(ulong *)(LStack_420._0_8_ + iVar48 * 0x10) <
                *(ulong *)(LStack_490._0_8_ + iVar49 * 0x10) && uVar50 == uVar33))
            goto LAB_016254ef;
          }
          else if (bVar68) {
LAB_016254ef:
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
            local_4c8 = local_4c8 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
      }
      goto LAB_0162aa67;
    }
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4d0 = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,local_4d0,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,local_4d0,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar42 = (string_t *)left->data;
        psVar65 = (string_t *)right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar42,psVar65);
              bVar36 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
            psVar42 = psVar42 + 1;
            psVar65 = psVar65 + 1;
          } while (count != uVar50);
          return local_4c8;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          uVar50 = 0;
          local_4c8 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar42,psVar65);
            }
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            uVar50 = uVar50 + 1;
            psVar42 = psVar42 + 1;
            psVar65 = psVar65 + 1;
          } while (count != uVar50);
          return local_4c8;
        }
        if (count != 0) {
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar42,psVar65);
              bVar68 = !bVar68;
            }
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar68;
            uVar50 = uVar50 + 1;
            psVar42 = psVar42 + 1;
            psVar65 = psVar65 + 1;
          } while (count != uVar50);
          goto LAB_0162bf1b;
        }
        goto LAB_0162bf18;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        psVar42 = (string_t *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar65 = (string_t *)left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162ce34;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (local_4d0->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)local_4d0->sel_vector[uVar50];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar65,psVar42);
                bVar68 = !bVar68;
              }
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
              psVar65 = psVar65 + 1;
            } while (count != uVar50);
            goto LAB_0162ce37;
          }
          if (count != 0) {
            uVar50 = 0;
            local_4c8 = 0;
            do {
              uVar33 = uVar50;
              if (local_4d0->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)local_4d0->sel_vector[uVar50];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar65,psVar42);
              }
              (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
              psVar65 = psVar65 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar50);
            goto LAB_0162d073;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar65,psVar42);
              bVar36 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
            psVar65 = psVar65 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar50);
          goto LAB_0162d073;
        }
        goto LAB_0162962c;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar42 = (string_t *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar65 = (string_t *)right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162cec8;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (local_4d0->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)local_4d0->sel_vector[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar42,psVar65);
                bVar68 = !bVar68;
              }
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
              psVar65 = psVar65 + 1;
            } while (count != uVar50);
            goto LAB_0162cecb;
          }
          if (count != 0) {
            uVar50 = 0;
            local_4c8 = 0;
            do {
              uVar33 = uVar50;
              if (local_4d0->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)local_4d0->sel_vector[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar42,psVar65);
              }
              (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
              psVar65 = psVar65 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar50);
            goto LAB_0162d073;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar42,psVar65);
              bVar36 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
            psVar65 = psVar65 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar50);
          goto LAB_0162d073;
        }
        goto LAB_0162962c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar69 | bVar68)) {
          if (!bVar68) {
LAB_0162b31e:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (true_sel.ptr)->sel_vector;
              iVar35 = 0;
              do {
                sVar46 = (sel_t)iVar35;
                if (psVar13 != (sel_t *)0x0) {
                  sVar46 = psVar13[iVar35];
                }
                psVar14[iVar35] = sVar46;
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              return count;
            }
            return count;
          }
        }
        else {
          bVar68 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)left->data,(string_t *)right->data);
          if (bVar68) goto LAB_0162b31e;
        }
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = local_4d0->sel_vector;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar46 = (sel_t)iVar35;
          if (psVar13 != (sel_t *)0x0) {
            sVar46 = psVar13[iVar35];
          }
          psVar14[iVar35] = sVar46;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    uVar17 = LStack_490._0_8_;
    uVar20 = LStack_420._0_8_;
    if (LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            lVar47 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            lVar34 = 0;
            iVar35 = 0;
            do {
              iVar60 = iVar35;
              if (psVar13 != (sel_t *)0x0) {
                iVar60 = (idx_t)psVar13[iVar35];
              }
              iVar49 = iVar35;
              if (lVar47 != 0) {
                iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
              }
              iVar48 = iVar35;
              if (psVar14 != (sel_t *)0x0) {
                iVar48 = (idx_t)psVar14[iVar35];
              }
              bVar68 = string_t::StringComparisonOperators::GreaterThan
                                 ((string_t *)(uVar17 + iVar49 * 0x10),
                                  (string_t *)(uVar20 + iVar48 * 0x10));
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
                lVar34 = lVar34 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            goto LAB_0162a884;
          }
          goto LAB_0162a882;
        }
        if (count == 0) goto LAB_0162536b;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        iVar35 = 0;
        local_4c8 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          bVar68 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)(uVar17 + iVar49 * 0x10),
                              (string_t *)(uVar20 + iVar48 * 0x10));
          if (bVar68) {
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
            local_4c8 = local_4c8 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
      }
      else {
        if (count == 0) goto LAB_0162536b;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4c8 = 0;
        iVar60 = 0;
        iVar35 = 0;
        do {
          iVar49 = iVar60;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar60];
          }
          iVar48 = iVar60;
          if (lVar47 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar47 + iVar60 * 4);
          }
          iVar51 = iVar60;
          if (psVar14 != (sel_t *)0x0) {
            iVar51 = (idx_t)psVar14[iVar60];
          }
          bVar68 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)(uVar17 + iVar48 * 0x10),
                              (string_t *)(uVar20 + iVar51 * 0x10));
          if (bVar68) {
            iVar48 = local_4c8;
            oVar30.ptr = true_sel.ptr;
            iVar51 = iVar35;
            local_4c8 = local_4c8 + 1;
          }
          else {
            iVar51 = iVar35 + 1;
            iVar48 = iVar35;
            oVar30.ptr = false_sel.ptr;
          }
          (oVar30.ptr)->sel_vector[iVar48] = (sel_t)iVar49;
          iVar60 = iVar60 + 1;
          iVar35 = iVar51;
        } while (count != iVar60);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_0162a882;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar34 = 0;
        iVar35 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1)
                     == 0;
          }
          if (bVar68 == true && !bVar69) {
            bVar68 = string_t::StringComparisonOperators::GreaterThan
                               ((string_t *)(uVar17 + iVar49 * 0x10),
                                (string_t *)(uVar20 + iVar48 * 0x10));
          }
          if (bVar68 == false) {
            (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
            lVar34 = lVar34 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        goto LAB_0162a884;
      }
      if (count == 0) goto LAB_0162536b;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      iVar35 = 0;
      local_4c8 = 0;
      do {
        iVar60 = iVar35;
        if (psVar13 != (sel_t *)0x0) {
          iVar60 = (idx_t)psVar13[iVar35];
        }
        iVar49 = iVar35;
        if (lVar47 != 0) {
          iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
        }
        iVar48 = iVar35;
        if (psVar14 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar14[iVar35];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 == true && !bVar69) {
          bVar68 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)(uVar17 + iVar49 * 0x10),
                              (string_t *)(uVar20 + iVar48 * 0x10));
        }
        if (bVar68 != false) {
          (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
          local_4c8 = local_4c8 + 1;
        }
        iVar35 = iVar35 + 1;
      } while (count != iVar35);
    }
    else {
      if (count == 0) goto LAB_0162536b;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4c8 = 0;
      iVar60 = 0;
      iVar35 = 0;
      do {
        iVar49 = iVar60;
        if (psVar13 != (sel_t *)0x0) {
          iVar49 = (idx_t)psVar13[iVar60];
        }
        iVar48 = iVar60;
        if (lVar47 != 0) {
          iVar48 = (idx_t)*(uint *)(lVar47 + iVar60 * 4);
        }
        iVar51 = iVar60;
        if (psVar14 != (sel_t *)0x0) {
          iVar51 = (idx_t)psVar14[iVar60];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar48 >> 6) * 8) >> (iVar48 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar51 >> 6] >> (iVar51 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 == true && !bVar69) {
          bVar68 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)(uVar17 + iVar48 * 0x10),
                              (string_t *)(uVar20 + iVar51 * 0x10));
        }
        if (bVar68 == false) {
          iVar51 = iVar35 + 1;
          iVar48 = iVar35;
          oVar30.ptr = false_sel.ptr;
        }
        else {
          iVar48 = local_4c8;
          oVar30.ptr = true_sel.ptr;
          iVar51 = iVar35;
          local_4c8 = local_4c8 + 1;
        }
        (oVar30.ptr)->sel_vector[iVar48] = (sel_t)iVar49;
        iVar60 = iVar60 + 1;
        iVar35 = iVar51;
      } while (count != iVar60);
    }
    goto LAB_0162a891;
  }
  switch(PVar1) {
  case BOOL:
  case INT8:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4d0 = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,local_4d0,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,local_4d0,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar10 = left->data;
        pdVar12 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          iVar35 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = (char)pdVar12[uVar50] < (char)pdVar10[uVar50];
              bVar36 = (char)pdVar10[uVar50] <= (char)pdVar12[uVar50];
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          iVar35 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = (char)pdVar12[uVar50] < (char)pdVar10[uVar50];
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = (char)pdVar10[uVar50] <= (char)pdVar12[uVar50];
            }
            psVar14[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162bfde;
        }
LAB_0162bfdc:
        lVar47 = 0;
LAB_0162bfde:
        return count - lVar47;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar10 = right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar12 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = (char)pdVar12[uVar50] <= (char)*pdVar10;
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4c8 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = (char)*pdVar10 < (char)pdVar12[uVar50];
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          local_4c8 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = (char)*pdVar10 < (char)pdVar12[uVar50];
              bVar36 = (char)pdVar12[uVar50] <= (char)*pdVar10;
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar10 = left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar12 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_0162d010:
              lVar47 = 0;
            }
            else {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (false_sel.ptr)->sel_vector;
              lVar47 = 0;
              uVar50 = 0;
              do {
                uVar33 = uVar50;
                if (psVar13 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar13[uVar50];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar68 = false;
                }
                else {
                  bVar68 = (*(byte *)local_498 & 1) == 0;
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if (!bVar69 && bVar68 == false) {
                  bVar68 = (char)*pdVar10 <= (char)pdVar12[uVar50];
                }
                psVar14[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)bVar68;
                uVar50 = uVar50 + 1;
              } while (count != uVar50);
            }
LAB_0162d012:
            local_4c8 = count - lVar47;
            local_118.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            goto LAB_0162d022;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4c8 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = (char)pdVar12[uVar50] < (char)*pdVar10;
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          local_4c8 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = (char)pdVar12[uVar50] < (char)*pdVar10;
              bVar36 = (char)*pdVar10 <= (char)pdVar12[uVar50];
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
LAB_01629797:
        local_4c8 = 0;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        goto LAB_0162d022;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar69 | bVar68)) {
          if (!bVar68) {
LAB_01627acc:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (true_sel.ptr)->sel_vector;
              iVar35 = 0;
              do {
                sVar46 = (sel_t)iVar35;
                if (psVar13 != (sel_t *)0x0) {
                  sVar46 = psVar13[iVar35];
                }
                psVar14[iVar35] = sVar46;
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              return count;
            }
            return count;
          }
        }
        else if ((char)*right->data < (char)*left->data) goto LAB_01627acc;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = local_4d0->sel_vector;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar46 = (sel_t)iVar35;
          if (psVar13 != (sel_t *)0x0) {
            sVar46 = psVar13[iVar35];
          }
          psVar14[iVar35] = sVar46;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0162a963;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar34 = 0;
          iVar35 = 0;
          do {
            iVar60 = iVar35;
            if (psVar13 != (sel_t *)0x0) {
              iVar60 = (idx_t)psVar13[iVar35];
            }
            iVar49 = iVar35;
            if (lVar47 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
            }
            iVar48 = iVar35;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar35];
            }
            if ((char)*(data_ptr_t)(LStack_490._0_8_ + iVar49) <=
                (char)*(data_ptr_t)(LStack_420._0_8_ + iVar48)) {
              (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
              lVar34 = lVar34 + 1;
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
LAB_0162aa64:
          local_4c8 = count - lVar34;
        }
        else {
          if (count == 0) goto LAB_0162550d;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          local_4c8 = 0;
          iVar35 = 0;
          do {
            iVar60 = iVar35;
            if (psVar13 != (sel_t *)0x0) {
              iVar60 = (idx_t)psVar13[iVar35];
            }
            iVar49 = iVar35;
            if (lVar47 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
            }
            iVar48 = iVar35;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar35];
            }
            if ((char)*(data_ptr_t)(LStack_420._0_8_ + iVar48) <
                (char)*(data_ptr_t)(LStack_490._0_8_ + iVar49)) {
              (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
              local_4c8 = local_4c8 + 1;
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
      }
      else if (count == 0) {
LAB_0162550d:
        local_4c8 = 0;
      }
      else {
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4c8 = 0;
        iVar60 = 0;
        iVar35 = 0;
        do {
          iVar49 = iVar60;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar60];
          }
          iVar48 = iVar60;
          if (lVar47 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar47 + iVar60 * 4);
          }
          iVar51 = iVar60;
          if (psVar14 != (sel_t *)0x0) {
            iVar51 = (idx_t)psVar14[iVar60];
          }
          if ((char)*(data_ptr_t)(LStack_420._0_8_ + iVar51) <
              (char)*(data_ptr_t)(LStack_490._0_8_ + iVar48)) {
            oVar30.ptr = true_sel.ptr;
            iVar48 = iVar35;
            iVar35 = local_4c8;
            local_4c8 = local_4c8 + 1;
          }
          else {
            iVar48 = iVar35 + 1;
            oVar30.ptr = false_sel.ptr;
          }
          (oVar30.ptr)->sel_vector[iVar35] = (sel_t)iVar49;
          iVar60 = iVar60 + 1;
          iVar35 = iVar48;
        } while (count != iVar60);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_0162aa5a;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar34 = 0;
        iVar35 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1)
                     == 0;
          }
          if (bVar68 && !bVar69) {
            if ((char)*(data_ptr_t)(LStack_490._0_8_ + iVar49) <=
                (char)*(data_ptr_t)(LStack_420._0_8_ + iVar48)) goto LAB_01627a93;
          }
          else if (!bVar68) {
LAB_01627a93:
            (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
            lVar34 = lVar34 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        goto LAB_0162aa64;
      }
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4c8 = 0;
      iVar35 = 0;
      do {
        iVar60 = iVar35;
        if (psVar13 != (sel_t *)0x0) {
          iVar60 = (idx_t)psVar13[iVar35];
        }
        iVar49 = iVar35;
        if (lVar47 != 0) {
          iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
        }
        iVar48 = iVar35;
        if (psVar14 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar14[iVar35];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if ((char)*(data_ptr_t)(LStack_420._0_8_ + iVar48) <
              (char)*(data_ptr_t)(LStack_490._0_8_ + iVar49)) goto LAB_016228ee;
        }
        else if (bVar68) {
LAB_016228ee:
          (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
          local_4c8 = local_4c8 + 1;
        }
        iVar35 = iVar35 + 1;
      } while (count != iVar35);
    }
    else {
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      iVar49 = 0;
      iVar35 = 0;
      iVar60 = 0;
      do {
        iVar48 = iVar49;
        if (psVar13 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar13[iVar49];
        }
        iVar51 = iVar49;
        if (lVar47 != 0) {
          iVar51 = (idx_t)*(uint *)(lVar47 + iVar49 * 4);
        }
        iVar39 = iVar49;
        if (psVar14 != (sel_t *)0x0) {
          iVar39 = (idx_t)psVar14[iVar49];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar51 >> 6) * 8) >> (iVar51 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if ((char)*(data_ptr_t)(LStack_490._0_8_ + iVar51) <=
              (char)*(data_ptr_t)(LStack_420._0_8_ + iVar39)) goto LAB_0161f888;
LAB_0161f8a7:
          local_4c8 = iVar60 + 1;
          iVar51 = iVar35;
          oVar30.ptr = true_sel.ptr;
        }
        else {
          if (bVar68) goto LAB_0161f8a7;
LAB_0161f888:
          iVar51 = iVar35 + 1;
          local_4c8 = iVar60;
          iVar60 = iVar35;
          oVar30.ptr = false_sel.ptr;
        }
        (oVar30.ptr)->sel_vector[iVar60] = (sel_t)iVar48;
        iVar49 = iVar49 + 1;
        iVar35 = iVar51;
        iVar60 = local_4c8;
      } while (count != iVar49);
    }
    break;
  case UINT8:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4d0 = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,local_4d0,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,local_4d0,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar10 = left->data;
        pdVar12 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          iVar35 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = pdVar12[uVar50] < pdVar10[uVar50];
              bVar36 = pdVar10[uVar50] <= pdVar12[uVar50];
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          iVar35 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = pdVar12[uVar50] < pdVar10[uVar50];
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = pdVar10[uVar50] <= pdVar12[uVar50];
            }
            psVar14[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162bfde;
        }
        goto LAB_0162bfdc;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pbVar8 = right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = pdVar10[uVar50] <= *pbVar8;
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4c8 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *pbVar8 < pdVar10[uVar50];
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          local_4c8 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *pbVar8 < pdVar10[uVar50];
              bVar36 = pdVar10[uVar50] <= *pbVar8;
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pbVar8 = left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *pbVar8 <= pdVar10[uVar50];
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4c8 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = pdVar10[uVar50] < *pbVar8;
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          local_4c8 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = pdVar10[uVar50] < *pbVar8;
              bVar36 = *pbVar8 <= pdVar10[uVar50];
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar69 | bVar68)) {
          if (!bVar68) {
LAB_0162b11a:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (true_sel.ptr)->sel_vector;
              iVar35 = 0;
              do {
                sVar46 = (sel_t)iVar35;
                if (psVar13 != (sel_t *)0x0) {
                  sVar46 = psVar13[iVar35];
                }
                psVar14[iVar35] = sVar46;
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              return count;
            }
            return count;
          }
        }
        else if (*right->data < *left->data) goto LAB_0162b11a;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = local_4d0->sel_vector;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar46 = (sel_t)iVar35;
          if (psVar13 != (sel_t *)0x0) {
            sVar46 = psVar13[iVar35];
          }
          psVar14[iVar35] = sVar46;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4c8 = 0;
        iVar60 = 0;
        iVar35 = 0;
        do {
          iVar49 = iVar60;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar60];
          }
          iVar48 = iVar60;
          if (lVar47 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar47 + iVar60 * 4);
          }
          iVar51 = iVar60;
          if (psVar14 != (sel_t *)0x0) {
            iVar51 = (idx_t)psVar14[iVar60];
          }
          if (*(byte *)(LStack_420._0_8_ + iVar51) < *(byte *)(LStack_490._0_8_ + iVar48)) {
            oVar30.ptr = true_sel.ptr;
            iVar48 = iVar35;
            iVar35 = local_4c8;
            local_4c8 = local_4c8 + 1;
          }
          else {
            iVar48 = iVar35 + 1;
            oVar30.ptr = false_sel.ptr;
          }
          (oVar30.ptr)->sel_vector[iVar35] = (sel_t)iVar49;
          iVar60 = iVar60 + 1;
          iVar35 = iVar48;
        } while (count != iVar60);
      }
      else {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0162a963;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar34 = 0;
          iVar35 = 0;
          do {
            iVar60 = iVar35;
            if (psVar13 != (sel_t *)0x0) {
              iVar60 = (idx_t)psVar13[iVar35];
            }
            iVar49 = iVar35;
            if (lVar47 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
            }
            iVar48 = iVar35;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar35];
            }
            if (*(byte *)(LStack_490._0_8_ + iVar49) <= *(byte *)(LStack_420._0_8_ + iVar48)) {
              (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
              lVar34 = lVar34 + 1;
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
          goto LAB_0162aa64;
        }
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        iVar35 = 0;
        local_4c8 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (*(byte *)(LStack_420._0_8_ + iVar48) < *(byte *)(LStack_490._0_8_ + iVar49)) {
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
            local_4c8 = local_4c8 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
      }
    }
    else if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      iVar49 = 0;
      iVar35 = 0;
      iVar60 = 0;
      do {
        iVar48 = iVar49;
        if (psVar13 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar13[iVar49];
        }
        iVar51 = iVar49;
        if (lVar47 != 0) {
          iVar51 = (idx_t)*(uint *)(lVar47 + iVar49 * 4);
        }
        iVar39 = iVar49;
        if (psVar14 != (sel_t *)0x0) {
          iVar39 = (idx_t)psVar14[iVar49];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar51 >> 6) * 8) >> (iVar51 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if (*(byte *)(LStack_490._0_8_ + iVar51) <= *(byte *)(LStack_420._0_8_ + iVar39))
          goto LAB_016229b7;
LAB_016229d6:
          local_4c8 = iVar60 + 1;
          iVar51 = iVar35;
          oVar30.ptr = true_sel.ptr;
        }
        else {
          if (bVar68) goto LAB_016229d6;
LAB_016229b7:
          iVar51 = iVar35 + 1;
          local_4c8 = iVar60;
          iVar60 = iVar35;
          oVar30.ptr = false_sel.ptr;
        }
        (oVar30.ptr)->sel_vector[iVar60] = (sel_t)iVar48;
        iVar49 = iVar49 + 1;
        iVar35 = iVar51;
        iVar60 = local_4c8;
      } while (count != iVar49);
    }
    else {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_0162aa5a;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar34 = 0;
        iVar35 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1)
                     == 0;
          }
          if (bVar68 && !bVar69) {
            if (*(byte *)(LStack_490._0_8_ + iVar49) <= *(byte *)(LStack_420._0_8_ + iVar48))
            goto LAB_0162a4a8;
          }
          else if (!bVar68) {
LAB_0162a4a8:
            (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
            lVar34 = lVar34 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        goto LAB_0162aa64;
      }
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      iVar35 = 0;
      local_4c8 = 0;
      do {
        iVar60 = iVar35;
        if (psVar13 != (sel_t *)0x0) {
          iVar60 = (idx_t)psVar13[iVar35];
        }
        iVar49 = iVar35;
        if (lVar47 != 0) {
          iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
        }
        iVar48 = iVar35;
        if (psVar14 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar14[iVar35];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if (*(byte *)(LStack_420._0_8_ + iVar48) < *(byte *)(LStack_490._0_8_ + iVar49))
          goto LAB_01624f0e;
        }
        else if (bVar68) {
LAB_01624f0e:
          (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
          local_4c8 = local_4c8 + 1;
        }
        iVar35 = iVar35 + 1;
      } while (count != iVar35);
    }
    break;
  case UINT16:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4d0 = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,local_4d0,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,local_4d0,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar10 = left->data;
        pdVar12 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          iVar35 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *(ushort *)(pdVar12 + uVar50 * 2) < *(ushort *)(pdVar10 + uVar50 * 2);
              bVar36 = *(ushort *)(pdVar10 + uVar50 * 2) <= *(ushort *)(pdVar12 + uVar50 * 2);
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          uVar50 = 0;
          iVar35 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(ushort *)(pdVar12 + uVar50 * 2) < *(ushort *)(pdVar10 + uVar50 * 2);
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = *(ushort *)(pdVar10 + uVar50 * 2) <= *(ushort *)(pdVar12 + uVar50 * 2);
            }
            psVar14[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162bfde;
        }
        goto LAB_0162bfdc;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar7 = (ushort *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *(ushort *)(pdVar10 + uVar50 * 2) <= *puVar7;
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            uVar50 = 0;
            local_4c8 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *puVar7 < *(ushort *)(pdVar10 + uVar50 * 2);
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *puVar7 < *(ushort *)(pdVar10 + uVar50 * 2);
              bVar36 = *(ushort *)(pdVar10 + uVar50 * 2) <= *puVar7;
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        puVar7 = (ushort *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *puVar7 <= *(ushort *)(pdVar10 + uVar50 * 2);
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            uVar50 = 0;
            local_4c8 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(ushort *)(pdVar10 + uVar50 * 2) < *puVar7;
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *(ushort *)(pdVar10 + uVar50 * 2) < *puVar7;
              bVar36 = *puVar7 <= *(ushort *)(pdVar10 + uVar50 * 2);
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar69 | bVar68)) {
          if (!bVar68) {
LAB_0162afa6:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (true_sel.ptr)->sel_vector;
              iVar35 = 0;
              do {
                sVar46 = (sel_t)iVar35;
                if (psVar13 != (sel_t *)0x0) {
                  sVar46 = psVar13[iVar35];
                }
                psVar14[iVar35] = sVar46;
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              return count;
            }
            return count;
          }
        }
        else if (*(ushort *)right->data < *(ushort *)left->data) goto LAB_0162afa6;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = local_4d0->sel_vector;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar46 = (sel_t)iVar35;
          if (psVar13 != (sel_t *)0x0) {
            sVar46 = psVar13[iVar35];
          }
          psVar14[iVar35] = sVar46;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0162a963;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar34 = 0;
          iVar35 = 0;
          do {
            iVar60 = iVar35;
            if (psVar13 != (sel_t *)0x0) {
              iVar60 = (idx_t)psVar13[iVar35];
            }
            iVar49 = iVar35;
            if (lVar47 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
            }
            iVar48 = iVar35;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar35];
            }
            if (*(ushort *)(LStack_490._0_8_ + iVar49 * 2) <=
                *(ushort *)(LStack_420._0_8_ + iVar48 * 2)) {
              (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
              lVar34 = lVar34 + 1;
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
          goto LAB_0162aa64;
        }
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        iVar35 = 0;
        local_4c8 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (*(ushort *)(LStack_420._0_8_ + iVar48 * 2) <
              *(ushort *)(LStack_490._0_8_ + iVar49 * 2)) {
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
            local_4c8 = local_4c8 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
      }
      else {
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4c8 = 0;
        iVar60 = 0;
        iVar35 = 0;
        do {
          iVar49 = iVar60;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar60];
          }
          iVar48 = iVar60;
          if (lVar47 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar47 + iVar60 * 4);
          }
          iVar51 = iVar60;
          if (psVar14 != (sel_t *)0x0) {
            iVar51 = (idx_t)psVar14[iVar60];
          }
          if (*(ushort *)(LStack_420._0_8_ + iVar51 * 2) <
              *(ushort *)(LStack_490._0_8_ + iVar48 * 2)) {
            oVar30.ptr = true_sel.ptr;
            iVar48 = iVar35;
            iVar35 = local_4c8;
            local_4c8 = local_4c8 + 1;
          }
          else {
            iVar48 = iVar35 + 1;
            oVar30.ptr = false_sel.ptr;
          }
          (oVar30.ptr)->sel_vector[iVar35] = (sel_t)iVar49;
          iVar60 = iVar60 + 1;
          iVar35 = iVar48;
        } while (count != iVar60);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_0162aa5a;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar34 = 0;
        iVar35 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1)
                     == 0;
          }
          if (bVar68 && !bVar69) {
            if (*(ushort *)(LStack_490._0_8_ + iVar49 * 2) <=
                *(ushort *)(LStack_420._0_8_ + iVar48 * 2)) goto LAB_0162a244;
          }
          else if (!bVar68) {
LAB_0162a244:
            (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
            lVar34 = lVar34 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        goto LAB_0162aa64;
      }
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      iVar35 = 0;
      local_4c8 = 0;
      do {
        iVar60 = iVar35;
        if (psVar13 != (sel_t *)0x0) {
          iVar60 = (idx_t)psVar13[iVar35];
        }
        iVar49 = iVar35;
        if (lVar47 != 0) {
          iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
        }
        iVar48 = iVar35;
        if (psVar14 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar14[iVar35];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if (*(ushort *)(LStack_420._0_8_ + iVar48 * 2) <
              *(ushort *)(LStack_490._0_8_ + iVar49 * 2)) goto LAB_01624c78;
        }
        else if (bVar68) {
LAB_01624c78:
          (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
          local_4c8 = local_4c8 + 1;
        }
        iVar35 = iVar35 + 1;
      } while (count != iVar35);
    }
    else {
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      iVar49 = 0;
      iVar35 = 0;
      iVar60 = 0;
      do {
        iVar48 = iVar49;
        if (psVar13 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar13[iVar49];
        }
        iVar51 = iVar49;
        if (lVar47 != 0) {
          iVar51 = (idx_t)*(uint *)(lVar47 + iVar49 * 4);
        }
        iVar39 = iVar49;
        if (psVar14 != (sel_t *)0x0) {
          iVar39 = (idx_t)psVar14[iVar49];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar51 >> 6) * 8) >> (iVar51 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if (*(ushort *)(LStack_490._0_8_ + iVar51 * 2) <=
              *(ushort *)(LStack_420._0_8_ + iVar39 * 2)) goto LAB_0162268c;
LAB_016226ad:
          local_4c8 = iVar60 + 1;
          iVar51 = iVar35;
          oVar30.ptr = true_sel.ptr;
        }
        else {
          if (bVar68) goto LAB_016226ad;
LAB_0162268c:
          iVar51 = iVar35 + 1;
          local_4c8 = iVar60;
          iVar60 = iVar35;
          oVar30.ptr = false_sel.ptr;
        }
        (oVar30.ptr)->sel_vector[iVar60] = (sel_t)iVar48;
        iVar49 = iVar49 + 1;
        iVar35 = iVar51;
        iVar60 = local_4c8;
      } while (count != iVar49);
    }
    break;
  case INT16:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4d0 = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,local_4d0,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,local_4d0,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar10 = left->data;
        pdVar12 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          iVar35 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *(short *)(pdVar12 + uVar50 * 2) < *(short *)(pdVar10 + uVar50 * 2);
              bVar36 = *(short *)(pdVar10 + uVar50 * 2) <= *(short *)(pdVar12 + uVar50 * 2);
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          iVar35 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(short *)(pdVar12 + uVar50 * 2) < *(short *)(pdVar10 + uVar50 * 2);
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = *(short *)(pdVar10 + uVar50 * 2) <= *(short *)(pdVar12 + uVar50 * 2);
            }
            psVar14[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162bfde;
        }
        goto LAB_0162bfdc;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        psVar6 = (short *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *(short *)(pdVar10 + uVar50 * 2) <= *psVar6;
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4c8 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *psVar6 < *(short *)(pdVar10 + uVar50 * 2);
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          local_4c8 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *psVar6 < *(short *)(pdVar10 + uVar50 * 2);
              bVar36 = *(short *)(pdVar10 + uVar50 * 2) <= *psVar6;
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar6 = (short *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *psVar6 <= *(short *)(pdVar10 + uVar50 * 2);
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4c8 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(short *)(pdVar10 + uVar50 * 2) < *psVar6;
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          local_4c8 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *(short *)(pdVar10 + uVar50 * 2) < *psVar6;
              bVar36 = *psVar6 <= *(short *)(pdVar10 + uVar50 * 2);
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar69 | bVar68)) {
          if (!bVar68) {
LAB_0162aeec:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (true_sel.ptr)->sel_vector;
              iVar35 = 0;
              do {
                sVar46 = (sel_t)iVar35;
                if (psVar13 != (sel_t *)0x0) {
                  sVar46 = psVar13[iVar35];
                }
                psVar14[iVar35] = sVar46;
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              return count;
            }
            return count;
          }
        }
        else if (*(short *)right->data < *(short *)left->data) goto LAB_0162aeec;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = local_4d0->sel_vector;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar46 = (sel_t)iVar35;
          if (psVar13 != (sel_t *)0x0) {
            sVar46 = psVar13[iVar35];
          }
          psVar14[iVar35] = sVar46;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0162a963;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar34 = 0;
          iVar35 = 0;
          do {
            iVar60 = iVar35;
            if (psVar13 != (sel_t *)0x0) {
              iVar60 = (idx_t)psVar13[iVar35];
            }
            iVar49 = iVar35;
            if (lVar47 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
            }
            iVar48 = iVar35;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar35];
            }
            if (*(short *)(LStack_490._0_8_ + iVar49 * 2) <=
                *(short *)(LStack_420._0_8_ + iVar48 * 2)) {
              (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
              lVar34 = lVar34 + 1;
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
          goto LAB_0162aa64;
        }
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4c8 = 0;
        iVar35 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (*(short *)(LStack_420._0_8_ + iVar48 * 2) < *(short *)(LStack_490._0_8_ + iVar49 * 2))
          {
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
            local_4c8 = local_4c8 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
      }
      else {
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4c8 = 0;
        iVar60 = 0;
        iVar35 = 0;
        do {
          iVar49 = iVar60;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar60];
          }
          iVar48 = iVar60;
          if (lVar47 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar47 + iVar60 * 4);
          }
          iVar51 = iVar60;
          if (psVar14 != (sel_t *)0x0) {
            iVar51 = (idx_t)psVar14[iVar60];
          }
          if (*(short *)(LStack_420._0_8_ + iVar51 * 2) < *(short *)(LStack_490._0_8_ + iVar48 * 2))
          {
            oVar30.ptr = true_sel.ptr;
            iVar48 = iVar35;
            iVar35 = local_4c8;
            local_4c8 = local_4c8 + 1;
          }
          else {
            iVar48 = iVar35 + 1;
            oVar30.ptr = false_sel.ptr;
          }
          (oVar30.ptr)->sel_vector[iVar35] = (sel_t)iVar49;
          iVar60 = iVar60 + 1;
          iVar35 = iVar48;
        } while (count != iVar60);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_0162aa5a;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar34 = 0;
        iVar35 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1)
                     == 0;
          }
          if (bVar68 && !bVar69) {
            if (*(short *)(LStack_490._0_8_ + iVar49 * 2) <=
                *(short *)(LStack_420._0_8_ + iVar48 * 2)) goto LAB_0162a10e;
          }
          else if (!bVar68) {
LAB_0162a10e:
            (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
            lVar34 = lVar34 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        goto LAB_0162aa64;
      }
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4c8 = 0;
      iVar35 = 0;
      do {
        iVar60 = iVar35;
        if (psVar13 != (sel_t *)0x0) {
          iVar60 = (idx_t)psVar13[iVar35];
        }
        iVar49 = iVar35;
        if (lVar47 != 0) {
          iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
        }
        iVar48 = iVar35;
        if (psVar14 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar14[iVar35];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if (*(short *)(LStack_420._0_8_ + iVar48 * 2) < *(short *)(LStack_490._0_8_ + iVar49 * 2))
          goto LAB_01624b29;
        }
        else if (bVar68) {
LAB_01624b29:
          (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
          local_4c8 = local_4c8 + 1;
        }
        iVar35 = iVar35 + 1;
      } while (count != iVar35);
    }
    else {
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      iVar49 = 0;
      iVar35 = 0;
      iVar60 = 0;
      do {
        iVar48 = iVar49;
        if (psVar13 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar13[iVar49];
        }
        iVar51 = iVar49;
        if (lVar47 != 0) {
          iVar51 = (idx_t)*(uint *)(lVar47 + iVar49 * 4);
        }
        iVar39 = iVar49;
        if (psVar14 != (sel_t *)0x0) {
          iVar39 = (idx_t)psVar14[iVar49];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar51 >> 6) * 8) >> (iVar51 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if (*(short *)(LStack_490._0_8_ + iVar51 * 2) <= *(short *)(LStack_420._0_8_ + iVar39 * 2)
             ) goto LAB_0162259b;
LAB_016225bc:
          local_4c8 = iVar60 + 1;
          iVar51 = iVar35;
          oVar30.ptr = true_sel.ptr;
        }
        else {
          if (bVar68) goto LAB_016225bc;
LAB_0162259b:
          iVar51 = iVar35 + 1;
          local_4c8 = iVar60;
          iVar60 = iVar35;
          oVar30.ptr = false_sel.ptr;
        }
        (oVar30.ptr)->sel_vector[iVar60] = (sel_t)iVar48;
        iVar49 = iVar49 + 1;
        iVar35 = iVar51;
        iVar60 = local_4c8;
      } while (count != iVar49);
    }
    break;
  case UINT32:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4d0 = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,local_4d0,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,local_4d0,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar10 = left->data;
        pdVar12 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          iVar35 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *(uint *)(pdVar12 + uVar50 * 4) < *(uint *)(pdVar10 + uVar50 * 4);
              bVar36 = *(uint *)(pdVar10 + uVar50 * 4) <= *(uint *)(pdVar12 + uVar50 * 4);
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          uVar50 = 0;
          iVar35 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(uint *)(pdVar12 + uVar50 * 4) < *(uint *)(pdVar10 + uVar50 * 4);
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = *(uint *)(pdVar10 + uVar50 * 4) <= *(uint *)(pdVar12 + uVar50 * 4);
            }
            psVar14[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162bfde;
        }
        goto LAB_0162bfdc;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar5 = (uint *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *(uint *)(pdVar10 + uVar50 * 4) <= *puVar5;
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            uVar50 = 0;
            local_4c8 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *puVar5 < *(uint *)(pdVar10 + uVar50 * 4);
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *puVar5 < *(uint *)(pdVar10 + uVar50 * 4);
              bVar36 = *(uint *)(pdVar10 + uVar50 * 4) <= *puVar5;
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        puVar5 = (uint *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *puVar5 <= *(uint *)(pdVar10 + uVar50 * 4);
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            uVar50 = 0;
            local_4c8 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(uint *)(pdVar10 + uVar50 * 4) < *puVar5;
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *(uint *)(pdVar10 + uVar50 * 4) < *puVar5;
              bVar36 = *puVar5 <= *(uint *)(pdVar10 + uVar50 * 4);
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar69 | bVar68)) {
          if (!bVar68) {
LAB_0162ae34:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (true_sel.ptr)->sel_vector;
              iVar35 = 0;
              do {
                sVar46 = (sel_t)iVar35;
                if (psVar13 != (sel_t *)0x0) {
                  sVar46 = psVar13[iVar35];
                }
                psVar14[iVar35] = sVar46;
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              return count;
            }
            return count;
          }
        }
        else if (*(uint *)right->data < *(uint *)left->data) goto LAB_0162ae34;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = local_4d0->sel_vector;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar46 = (sel_t)iVar35;
          if (psVar13 != (sel_t *)0x0) {
            sVar46 = psVar13[iVar35];
          }
          psVar14[iVar35] = sVar46;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0162a963;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar34 = 0;
          iVar35 = 0;
          do {
            iVar60 = iVar35;
            if (psVar13 != (sel_t *)0x0) {
              iVar60 = (idx_t)psVar13[iVar35];
            }
            iVar49 = iVar35;
            if (lVar47 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
            }
            iVar48 = iVar35;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar35];
            }
            if (*(uint *)(LStack_490._0_8_ + iVar49 * 4) <= *(uint *)(LStack_420._0_8_ + iVar48 * 4)
               ) {
              (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
              lVar34 = lVar34 + 1;
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
          goto LAB_0162aa64;
        }
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        iVar35 = 0;
        local_4c8 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (*(uint *)(LStack_420._0_8_ + iVar48 * 4) < *(uint *)(LStack_490._0_8_ + iVar49 * 4)) {
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
            local_4c8 = local_4c8 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
      }
      else {
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4c8 = 0;
        iVar60 = 0;
        iVar35 = 0;
        do {
          iVar49 = iVar60;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar60];
          }
          iVar48 = iVar60;
          if (lVar47 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar47 + iVar60 * 4);
          }
          iVar51 = iVar60;
          if (psVar14 != (sel_t *)0x0) {
            iVar51 = (idx_t)psVar14[iVar60];
          }
          if (*(uint *)(LStack_420._0_8_ + iVar51 * 4) < *(uint *)(LStack_490._0_8_ + iVar48 * 4)) {
            oVar30.ptr = true_sel.ptr;
            iVar48 = iVar35;
            iVar35 = local_4c8;
            local_4c8 = local_4c8 + 1;
          }
          else {
            iVar48 = iVar35 + 1;
            oVar30.ptr = false_sel.ptr;
          }
          (oVar30.ptr)->sel_vector[iVar35] = (sel_t)iVar49;
          iVar60 = iVar60 + 1;
          iVar35 = iVar48;
        } while (count != iVar60);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_0162aa5a;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar34 = 0;
        iVar35 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1)
                     == 0;
          }
          if (bVar68 && !bVar69) {
            if (*(uint *)(LStack_490._0_8_ + iVar49 * 4) <= *(uint *)(LStack_420._0_8_ + iVar48 * 4)
               ) goto LAB_01629fd8;
          }
          else if (!bVar68) {
LAB_01629fd8:
            (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
            lVar34 = lVar34 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        goto LAB_0162aa64;
      }
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      iVar35 = 0;
      local_4c8 = 0;
      do {
        iVar60 = iVar35;
        if (psVar13 != (sel_t *)0x0) {
          iVar60 = (idx_t)psVar13[iVar35];
        }
        iVar49 = iVar35;
        if (lVar47 != 0) {
          iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
        }
        iVar48 = iVar35;
        if (psVar14 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar14[iVar35];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if (*(uint *)(LStack_420._0_8_ + iVar48 * 4) < *(uint *)(LStack_490._0_8_ + iVar49 * 4))
          goto LAB_016249da;
        }
        else if (bVar68) {
LAB_016249da:
          (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
          local_4c8 = local_4c8 + 1;
        }
        iVar35 = iVar35 + 1;
      } while (count != iVar35);
    }
    else {
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      iVar49 = 0;
      iVar35 = 0;
      iVar60 = 0;
      do {
        iVar48 = iVar49;
        if (psVar13 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar13[iVar49];
        }
        iVar51 = iVar49;
        if (lVar47 != 0) {
          iVar51 = (idx_t)*(uint *)(lVar47 + iVar49 * 4);
        }
        iVar39 = iVar49;
        if (psVar14 != (sel_t *)0x0) {
          iVar39 = (idx_t)psVar14[iVar49];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar51 >> 6) * 8) >> (iVar51 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if (*(uint *)(LStack_490._0_8_ + iVar51 * 4) <= *(uint *)(LStack_420._0_8_ + iVar39 * 4))
          goto LAB_016224ac;
LAB_016224cb:
          local_4c8 = iVar60 + 1;
          iVar51 = iVar35;
          oVar30.ptr = true_sel.ptr;
        }
        else {
          if (bVar68) goto LAB_016224cb;
LAB_016224ac:
          iVar51 = iVar35 + 1;
          local_4c8 = iVar60;
          iVar60 = iVar35;
          oVar30.ptr = false_sel.ptr;
        }
        (oVar30.ptr)->sel_vector[iVar60] = (sel_t)iVar48;
        iVar49 = iVar49 + 1;
        iVar35 = iVar51;
        iVar60 = local_4c8;
      } while (count != iVar49);
    }
    break;
  case INT32:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4d0 = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,local_4d0,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,local_4d0,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar10 = left->data;
        pdVar12 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          iVar35 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *(int *)(pdVar12 + uVar50 * 4) < *(int *)(pdVar10 + uVar50 * 4);
              bVar36 = *(int *)(pdVar10 + uVar50 * 4) <= *(int *)(pdVar12 + uVar50 * 4);
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          iVar35 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(int *)(pdVar12 + uVar50 * 4) < *(int *)(pdVar10 + uVar50 * 4);
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = *(int *)(pdVar10 + uVar50 * 4) <= *(int *)(pdVar12 + uVar50 * 4);
            }
            psVar14[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162bfde;
        }
        goto LAB_0162bfdc;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar57 = (int *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *(int *)(pdVar10 + uVar50 * 4) <= *piVar57;
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4c8 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *piVar57 < *(int *)(pdVar10 + uVar50 * 4);
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          local_4c8 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *piVar57 < *(int *)(pdVar10 + uVar50 * 4);
              bVar36 = *(int *)(pdVar10 + uVar50 * 4) <= *piVar57;
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar57 = (int *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *piVar57 <= *(int *)(pdVar10 + uVar50 * 4);
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4c8 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(int *)(pdVar10 + uVar50 * 4) < *piVar57;
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          local_4c8 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *(int *)(pdVar10 + uVar50 * 4) < *piVar57;
              bVar36 = *piVar57 <= *(int *)(pdVar10 + uVar50 * 4);
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar69 | bVar68)) {
          if (!bVar68) {
LAB_0162ad7c:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (true_sel.ptr)->sel_vector;
              iVar35 = 0;
              do {
                sVar46 = (sel_t)iVar35;
                if (psVar13 != (sel_t *)0x0) {
                  sVar46 = psVar13[iVar35];
                }
                psVar14[iVar35] = sVar46;
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              return count;
            }
            return count;
          }
        }
        else if (*(int *)right->data < *(int *)left->data) goto LAB_0162ad7c;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = local_4d0->sel_vector;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar46 = (sel_t)iVar35;
          if (psVar13 != (sel_t *)0x0) {
            sVar46 = psVar13[iVar35];
          }
          psVar14[iVar35] = sVar46;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0162a963;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar34 = 0;
          iVar35 = 0;
          do {
            iVar60 = iVar35;
            if (psVar13 != (sel_t *)0x0) {
              iVar60 = (idx_t)psVar13[iVar35];
            }
            iVar49 = iVar35;
            if (lVar47 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
            }
            iVar48 = iVar35;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar35];
            }
            if (*(int *)(LStack_490._0_8_ + iVar49 * 4) <= *(int *)(LStack_420._0_8_ + iVar48 * 4))
            {
              (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
              lVar34 = lVar34 + 1;
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
          goto LAB_0162aa64;
        }
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4c8 = 0;
        iVar35 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (*(int *)(LStack_420._0_8_ + iVar48 * 4) < *(int *)(LStack_490._0_8_ + iVar49 * 4)) {
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
            local_4c8 = local_4c8 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
      }
      else {
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4c8 = 0;
        iVar60 = 0;
        iVar35 = 0;
        do {
          iVar49 = iVar60;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar60];
          }
          iVar48 = iVar60;
          if (lVar47 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar47 + iVar60 * 4);
          }
          iVar51 = iVar60;
          if (psVar14 != (sel_t *)0x0) {
            iVar51 = (idx_t)psVar14[iVar60];
          }
          if (*(int *)(LStack_420._0_8_ + iVar51 * 4) < *(int *)(LStack_490._0_8_ + iVar48 * 4)) {
            oVar30.ptr = true_sel.ptr;
            iVar48 = iVar35;
            iVar35 = local_4c8;
            local_4c8 = local_4c8 + 1;
          }
          else {
            iVar48 = iVar35 + 1;
            oVar30.ptr = false_sel.ptr;
          }
          (oVar30.ptr)->sel_vector[iVar35] = (sel_t)iVar49;
          iVar60 = iVar60 + 1;
          iVar35 = iVar48;
        } while (count != iVar60);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_0162aa5a;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar34 = 0;
        iVar35 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1)
                     == 0;
          }
          if (bVar68 && !bVar69) {
            if (*(int *)(LStack_490._0_8_ + iVar49 * 4) <= *(int *)(LStack_420._0_8_ + iVar48 * 4))
            goto LAB_01629ea6;
          }
          else if (!bVar68) {
LAB_01629ea6:
            (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
            lVar34 = lVar34 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        goto LAB_0162aa64;
      }
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4c8 = 0;
      iVar35 = 0;
      do {
        iVar60 = iVar35;
        if (psVar13 != (sel_t *)0x0) {
          iVar60 = (idx_t)psVar13[iVar35];
        }
        iVar49 = iVar35;
        if (lVar47 != 0) {
          iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
        }
        iVar48 = iVar35;
        if (psVar14 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar14[iVar35];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if (*(int *)(LStack_420._0_8_ + iVar48 * 4) < *(int *)(LStack_490._0_8_ + iVar49 * 4))
          goto LAB_0162488f;
        }
        else if (bVar68) {
LAB_0162488f:
          (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
          local_4c8 = local_4c8 + 1;
        }
        iVar35 = iVar35 + 1;
      } while (count != iVar35);
    }
    else {
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      iVar49 = 0;
      iVar35 = 0;
      iVar60 = 0;
      do {
        iVar48 = iVar49;
        if (psVar13 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar13[iVar49];
        }
        iVar51 = iVar49;
        if (lVar47 != 0) {
          iVar51 = (idx_t)*(uint *)(lVar47 + iVar49 * 4);
        }
        iVar39 = iVar49;
        if (psVar14 != (sel_t *)0x0) {
          iVar39 = (idx_t)psVar14[iVar49];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar51 >> 6) * 8) >> (iVar51 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if (*(int *)(LStack_490._0_8_ + iVar51 * 4) <= *(int *)(LStack_420._0_8_ + iVar39 * 4))
          goto LAB_016223bd;
LAB_016223dc:
          local_4c8 = iVar60 + 1;
          iVar51 = iVar35;
          oVar30.ptr = true_sel.ptr;
        }
        else {
          if (bVar68) goto LAB_016223dc;
LAB_016223bd:
          iVar51 = iVar35 + 1;
          local_4c8 = iVar60;
          iVar60 = iVar35;
          oVar30.ptr = false_sel.ptr;
        }
        (oVar30.ptr)->sel_vector[iVar60] = (sel_t)iVar48;
        iVar49 = iVar49 + 1;
        iVar35 = iVar51;
        iVar60 = local_4c8;
      } while (count != iVar49);
    }
    break;
  case UINT64:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4d0 = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,local_4d0,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,local_4d0,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar10 = left->data;
        pdVar12 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          iVar35 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *(ulong *)(pdVar12 + uVar50 * 8) < *(ulong *)(pdVar10 + uVar50 * 8);
              bVar36 = *(ulong *)(pdVar10 + uVar50 * 8) <= *(ulong *)(pdVar12 + uVar50 * 8);
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          uVar50 = 0;
          iVar35 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(ulong *)(pdVar12 + uVar50 * 8) < *(ulong *)(pdVar10 + uVar50 * 8);
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = *(ulong *)(pdVar10 + uVar50 * 8) <= *(ulong *)(pdVar12 + uVar50 * 8);
            }
            psVar14[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162bfde;
        }
        goto LAB_0162bfdc;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar9 = (ulong *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *(ulong *)(pdVar10 + uVar50 * 8) <= *puVar9;
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            uVar50 = 0;
            local_4c8 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *puVar9 < *(ulong *)(pdVar10 + uVar50 * 8);
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *puVar9 < *(ulong *)(pdVar10 + uVar50 * 8);
              bVar36 = *(ulong *)(pdVar10 + uVar50 * 8) <= *puVar9;
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        puVar9 = (ulong *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *puVar9 <= *(ulong *)(pdVar10 + uVar50 * 8);
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            uVar50 = 0;
            local_4c8 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(ulong *)(pdVar10 + uVar50 * 8) < *puVar9;
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *(ulong *)(pdVar10 + uVar50 * 8) < *puVar9;
              bVar36 = *puVar9 <= *(ulong *)(pdVar10 + uVar50 * 8);
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar69 | bVar68)) {
          if (!bVar68) {
LAB_0162b264:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (true_sel.ptr)->sel_vector;
              iVar35 = 0;
              do {
                sVar46 = (sel_t)iVar35;
                if (psVar13 != (sel_t *)0x0) {
                  sVar46 = psVar13[iVar35];
                }
                psVar14[iVar35] = sVar46;
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              return count;
            }
            return count;
          }
        }
        else if (*(ulong *)right->data < *(ulong *)left->data) goto LAB_0162b264;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = local_4d0->sel_vector;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar46 = (sel_t)iVar35;
          if (psVar13 != (sel_t *)0x0) {
            sVar46 = psVar13[iVar35];
          }
          psVar14[iVar35] = sVar46;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            lVar47 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            lVar34 = 0;
            iVar35 = 0;
            do {
              iVar60 = iVar35;
              if (psVar13 != (sel_t *)0x0) {
                iVar60 = (idx_t)psVar13[iVar35];
              }
              iVar49 = iVar35;
              if (lVar47 != 0) {
                iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
              }
              iVar48 = iVar35;
              if (psVar14 != (sel_t *)0x0) {
                iVar48 = (idx_t)psVar14[iVar35];
              }
              if (*(ulong *)(LStack_490._0_8_ + iVar49 * 8) <=
                  *(ulong *)(LStack_420._0_8_ + iVar48 * 8)) {
                (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
                lVar34 = lVar34 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            goto LAB_0162aa64;
          }
LAB_0162a963:
          lVar34 = 0;
          goto LAB_0162aa64;
        }
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        iVar35 = 0;
        local_4c8 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (*(ulong *)(LStack_420._0_8_ + iVar48 * 8) < *(ulong *)(LStack_490._0_8_ + iVar49 * 8))
          {
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
            local_4c8 = local_4c8 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
      }
      else {
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4c8 = 0;
        iVar60 = 0;
        iVar35 = 0;
        do {
          iVar49 = iVar60;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar60];
          }
          iVar48 = iVar60;
          if (lVar47 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar47 + iVar60 * 4);
          }
          iVar51 = iVar60;
          if (psVar14 != (sel_t *)0x0) {
            iVar51 = (idx_t)psVar14[iVar60];
          }
          if (*(ulong *)(LStack_420._0_8_ + iVar51 * 8) < *(ulong *)(LStack_490._0_8_ + iVar48 * 8))
          {
            oVar30.ptr = true_sel.ptr;
            iVar48 = iVar35;
            iVar35 = local_4c8;
            local_4c8 = local_4c8 + 1;
          }
          else {
            iVar48 = iVar35 + 1;
            oVar30.ptr = false_sel.ptr;
          }
          (oVar30.ptr)->sel_vector[iVar35] = (sel_t)iVar49;
          iVar60 = iVar60 + 1;
          iVar35 = iVar48;
        } while (count != iVar60);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_0162aa5a;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar34 = 0;
        iVar35 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1)
                     == 0;
          }
          if (bVar68 && !bVar69) {
            if (*(ulong *)(LStack_490._0_8_ + iVar49 * 8) <=
                *(ulong *)(LStack_420._0_8_ + iVar48 * 8)) goto LAB_0162a5da;
          }
          else if (!bVar68) {
LAB_0162a5da:
            (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
            lVar34 = lVar34 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        goto LAB_0162aa64;
      }
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      iVar35 = 0;
      local_4c8 = 0;
      do {
        iVar60 = iVar35;
        if (psVar13 != (sel_t *)0x0) {
          iVar60 = (idx_t)psVar13[iVar35];
        }
        iVar49 = iVar35;
        if (lVar47 != 0) {
          iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
        }
        iVar48 = iVar35;
        if (psVar14 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar14[iVar35];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if (*(ulong *)(LStack_420._0_8_ + iVar48 * 8) < *(ulong *)(LStack_490._0_8_ + iVar49 * 8))
          goto LAB_01625059;
        }
        else if (bVar68) {
LAB_01625059:
          (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
          local_4c8 = local_4c8 + 1;
        }
        iVar35 = iVar35 + 1;
      } while (count != iVar35);
    }
    else {
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      iVar49 = 0;
      iVar35 = 0;
      iVar60 = 0;
      do {
        iVar48 = iVar49;
        if (psVar13 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar13[iVar49];
        }
        iVar51 = iVar49;
        if (lVar47 != 0) {
          iVar51 = (idx_t)*(uint *)(lVar47 + iVar49 * 4);
        }
        iVar39 = iVar49;
        if (psVar14 != (sel_t *)0x0) {
          iVar39 = (idx_t)psVar14[iVar49];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar51 >> 6) * 8) >> (iVar51 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if (*(ulong *)(LStack_490._0_8_ + iVar51 * 8) <= *(ulong *)(LStack_420._0_8_ + iVar39 * 8)
             ) goto LAB_01622aa6;
LAB_01622ac5:
          local_4c8 = iVar60 + 1;
          iVar51 = iVar35;
          oVar30.ptr = true_sel.ptr;
        }
        else {
          if (bVar68) goto LAB_01622ac5;
LAB_01622aa6:
          iVar51 = iVar35 + 1;
          local_4c8 = iVar60;
          iVar60 = iVar35;
          oVar30.ptr = false_sel.ptr;
        }
        (oVar30.ptr)->sel_vector[iVar60] = (sel_t)iVar48;
        iVar49 = iVar49 + 1;
        iVar35 = iVar51;
        iVar60 = local_4c8;
      } while (count != iVar49);
    }
    break;
  case INT64:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4d0 = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,local_4d0,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,local_4d0,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar10 = left->data;
        pdVar12 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          iVar35 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *(long *)(pdVar12 + uVar50 * 8) < *(long *)(pdVar10 + uVar50 * 8);
              bVar36 = *(long *)(pdVar10 + uVar50 * 8) <= *(long *)(pdVar12 + uVar50 * 8);
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          iVar35 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = *(long *)(pdVar12 + uVar50 * 8) < *(long *)(pdVar10 + uVar50 * 8);
            }
            psVar14[iVar35] = (sel_t)uVar33;
            iVar35 = iVar35 + bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          return iVar35;
        }
        if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (false_sel.ptr)->sel_vector;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = *(long *)(pdVar10 + uVar50 * 8) <= *(long *)(pdVar12 + uVar50 * 8);
            }
            psVar14[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar68;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162bfde;
        }
        goto LAB_0162bfdc;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        plVar44 = (long *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *(long *)(pdVar10 + uVar50 * 8) <= *plVar44;
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4c8 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *plVar44 < *(long *)(pdVar10 + uVar50 * 8);
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          local_4c8 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *plVar44 < *(long *)(pdVar10 + uVar50 * 8);
              bVar36 = *(long *)(pdVar10 + uVar50 * 8) <= *plVar44;
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        plVar44 = (long *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d010;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = *plVar44 <= *(long *)(pdVar10 + uVar50 * 8);
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d012;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            local_4c8 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = *(long *)(pdVar10 + uVar50 * 8) < *plVar44;
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
            goto LAB_0162d022;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          local_4c8 = 0;
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = *(long *)(pdVar10 + uVar50 * 8) < *plVar44;
              bVar36 = *plVar44 <= *(long *)(pdVar10 + uVar50 * 8);
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162d022;
        }
        goto LAB_01629797;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar69 | bVar68)) {
          if (!bVar68) {
LAB_0162b060:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (true_sel.ptr)->sel_vector;
              iVar35 = 0;
              do {
                sVar46 = (sel_t)iVar35;
                if (psVar13 != (sel_t *)0x0) {
                  sVar46 = psVar13[iVar35];
                }
                psVar14[iVar35] = sVar46;
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              return count;
            }
            return count;
          }
        }
        else if (*(long *)right->data < *(long *)left->data) goto LAB_0162b060;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = local_4d0->sel_vector;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar46 = (sel_t)iVar35;
          if (psVar13 != (sel_t *)0x0) {
            sVar46 = psVar13[iVar35];
          }
          psVar14[iVar35] = sVar46;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0162a963;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar34 = 0;
          iVar35 = 0;
          do {
            iVar60 = iVar35;
            if (psVar13 != (sel_t *)0x0) {
              iVar60 = (idx_t)psVar13[iVar35];
            }
            iVar49 = iVar35;
            if (lVar47 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
            }
            iVar48 = iVar35;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar35];
            }
            if (*(long *)(LStack_490._0_8_ + iVar49 * 8) <= *(long *)(LStack_420._0_8_ + iVar48 * 8)
               ) {
              (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
              lVar34 = lVar34 + 1;
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
          goto LAB_0162aa64;
        }
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4c8 = 0;
        iVar35 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (*(long *)(LStack_420._0_8_ + iVar48 * 8) < *(long *)(LStack_490._0_8_ + iVar49 * 8)) {
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
            local_4c8 = local_4c8 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
      }
      else {
        if (count == 0) goto LAB_0162550d;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4c8 = 0;
        iVar60 = 0;
        iVar35 = 0;
        do {
          iVar49 = iVar60;
          if (psVar13 != (sel_t *)0x0) {
            iVar49 = (idx_t)psVar13[iVar60];
          }
          iVar48 = iVar60;
          if (lVar47 != 0) {
            iVar48 = (idx_t)*(uint *)(lVar47 + iVar60 * 4);
          }
          iVar51 = iVar60;
          if (psVar14 != (sel_t *)0x0) {
            iVar51 = (idx_t)psVar14[iVar60];
          }
          if (*(long *)(LStack_420._0_8_ + iVar51 * 8) < *(long *)(LStack_490._0_8_ + iVar48 * 8)) {
            oVar30.ptr = true_sel.ptr;
            iVar48 = iVar35;
            iVar35 = local_4c8;
            local_4c8 = local_4c8 + 1;
          }
          else {
            iVar48 = iVar35 + 1;
            oVar30.ptr = false_sel.ptr;
          }
          (oVar30.ptr)->sel_vector[iVar35] = (sel_t)iVar49;
          iVar60 = iVar60 + 1;
          iVar35 = iVar48;
        } while (count != iVar60);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar34 = 0;
          iVar35 = 0;
          do {
            iVar60 = iVar35;
            if (psVar13 != (sel_t *)0x0) {
              iVar60 = (idx_t)psVar13[iVar35];
            }
            iVar49 = iVar35;
            if (lVar47 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
            }
            iVar48 = iVar35;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar35];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              if (*(long *)(LStack_490._0_8_ + iVar49 * 8) <=
                  *(long *)(LStack_420._0_8_ + iVar48 * 8)) goto LAB_0162a376;
            }
            else if (!bVar68) {
LAB_0162a376:
              (false_sel.ptr)->sel_vector[lVar34] = (sel_t)iVar60;
              lVar34 = lVar34 + 1;
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
          goto LAB_0162aa64;
        }
LAB_0162aa5a:
        lVar34 = 0;
        goto LAB_0162aa64;
      }
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4c8 = 0;
      iVar35 = 0;
      do {
        iVar60 = iVar35;
        if (psVar13 != (sel_t *)0x0) {
          iVar60 = (idx_t)psVar13[iVar35];
        }
        iVar49 = iVar35;
        if (lVar47 != 0) {
          iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
        }
        iVar48 = iVar35;
        if (psVar14 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar14[iVar35];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if (*(long *)(LStack_420._0_8_ + iVar48 * 8) < *(long *)(LStack_490._0_8_ + iVar49 * 8))
          goto LAB_01624dc3;
        }
        else if (bVar68) {
LAB_01624dc3:
          (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
          local_4c8 = local_4c8 + 1;
        }
        iVar35 = iVar35 + 1;
      } while (count != iVar35);
    }
    else {
      if (count == 0) goto LAB_0162550d;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      iVar49 = 0;
      iVar35 = 0;
      iVar60 = 0;
      do {
        iVar48 = iVar49;
        if (psVar13 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar13[iVar49];
        }
        iVar51 = iVar49;
        if (lVar47 != 0) {
          iVar51 = (idx_t)*(uint *)(lVar47 + iVar49 * 4);
        }
        iVar39 = iVar49;
        if (psVar14 != (sel_t *)0x0) {
          iVar39 = (idx_t)psVar14[iVar49];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar51 >> 6) * 8) >> (iVar51 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          if (*(long *)(LStack_490._0_8_ + iVar51 * 8) <= *(long *)(LStack_420._0_8_ + iVar39 * 8))
          goto LAB_0162277d;
LAB_0162279c:
          local_4c8 = iVar60 + 1;
          iVar51 = iVar35;
          oVar30.ptr = true_sel.ptr;
        }
        else {
          if (bVar68) goto LAB_0162279c;
LAB_0162277d:
          iVar51 = iVar35 + 1;
          local_4c8 = iVar60;
          iVar60 = iVar35;
          oVar30.ptr = false_sel.ptr;
        }
        (oVar30.ptr)->sel_vector[iVar60] = (sel_t)iVar48;
        iVar49 = iVar49 + 1;
        iVar35 = iVar51;
        iVar60 = local_4c8;
      } while (count != iVar49);
    }
    break;
  default:
switchD_0161deea_caseD_a:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    local_498 = (undefined1  [8])&LStack_490.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498,"Invalid type for distinct selection","");
    InternalException::InternalException(this_02,(string *)local_498);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4d0 = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,local_4d0,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,local_4d0,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar40 = (float *)left->data;
        pfVar63 = (float *)right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = GreaterThan::Operation<float>(pfVar40,pfVar63);
              bVar36 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
            pfVar40 = pfVar40 + 1;
            pfVar63 = pfVar63 + 1;
          } while (count != uVar50);
          return local_4c8;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          uVar50 = 0;
          local_4c8 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = GreaterThan::Operation<float>(pfVar40,pfVar63);
            }
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            uVar50 = uVar50 + 1;
            pfVar40 = pfVar40 + 1;
            pfVar63 = pfVar63 + 1;
          } while (count != uVar50);
          return local_4c8;
        }
        if (count != 0) {
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = GreaterThan::Operation<float>(pfVar40,pfVar63);
              bVar68 = !bVar68;
            }
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar68;
            uVar50 = uVar50 + 1;
            pfVar40 = pfVar40 + 1;
            pfVar63 = pfVar63 + 1;
          } while (count != uVar50);
          goto LAB_0162bf1b;
        }
LAB_0162bf18:
        lVar47 = 0;
LAB_0162bf1b:
        return count - lVar47;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pfVar40 = (float *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pfVar63 = (float *)left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_0162ce34:
              lVar47 = 0;
            }
            else {
              lVar47 = 0;
              uVar50 = 0;
              do {
                uVar33 = uVar50;
                if (local_4d0->sel_vector != (sel_t *)0x0) {
                  uVar33 = (ulong)local_4d0->sel_vector[uVar50];
                }
                puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar68 = false;
                }
                else {
                  bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (*(byte *)local_498 & 1) == 0;
                }
                if (!bVar69 && bVar68 == false) {
                  bVar68 = GreaterThan::Operation<float>(pfVar63,pfVar40);
                  bVar68 = !bVar68;
                }
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)bVar68;
                uVar50 = uVar50 + 1;
                pfVar63 = pfVar63 + 1;
              } while (count != uVar50);
            }
LAB_0162ce37:
            local_4c8 = count - lVar47;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            goto LAB_0162d073;
          }
          if (count != 0) {
            uVar50 = 0;
            local_4c8 = 0;
            do {
              uVar33 = uVar50;
              if (local_4d0->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)local_4d0->sel_vector[uVar50];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = GreaterThan::Operation<float>(pfVar63,pfVar40);
              }
              (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
              pfVar63 = pfVar63 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar50);
            goto LAB_0162d073;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = GreaterThan::Operation<float>(pfVar63,pfVar40);
              bVar36 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
            pfVar63 = pfVar63 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar50);
          goto LAB_0162d073;
        }
        goto LAB_0162962c;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar40 = (float *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pfVar63 = (float *)right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_0162cec8:
              lVar47 = 0;
            }
            else {
              lVar47 = 0;
              uVar50 = 0;
              do {
                uVar33 = uVar50;
                if (local_4d0->sel_vector != (sel_t *)0x0) {
                  uVar33 = (ulong)local_4d0->sel_vector[uVar50];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar68 = false;
                }
                else {
                  bVar68 = (*(byte *)local_498 & 1) == 0;
                }
                puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
                }
                if (!bVar69 && bVar68 == false) {
                  bVar68 = GreaterThan::Operation<float>(pfVar40,pfVar63);
                  bVar68 = !bVar68;
                }
                (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)bVar68;
                uVar50 = uVar50 + 1;
                pfVar63 = pfVar63 + 1;
              } while (count != uVar50);
            }
LAB_0162cecb:
            local_4c8 = count - lVar47;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            goto LAB_0162d073;
          }
          if (count != 0) {
            uVar50 = 0;
            local_4c8 = 0;
            do {
              uVar33 = uVar50;
              if (local_4d0->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)local_4d0->sel_vector[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = GreaterThan::Operation<float>(pfVar40,pfVar63);
              }
              (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
              pfVar63 = pfVar63 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar50);
            goto LAB_0162d073;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = GreaterThan::Operation<float>(pfVar40,pfVar63);
              bVar36 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
            pfVar63 = pfVar63 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar50);
          goto LAB_0162d073;
        }
        goto LAB_0162962c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar69 | bVar68)) {
          if (!bVar68) {
LAB_0162aac3:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (true_sel.ptr)->sel_vector;
              iVar35 = 0;
              do {
                sVar46 = (sel_t)iVar35;
                if (psVar13 != (sel_t *)0x0) {
                  sVar46 = psVar13[iVar35];
                }
                psVar14[iVar35] = sVar46;
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              return count;
            }
            return count;
          }
        }
        else {
          bVar68 = GreaterThan::Operation<float>((float *)left->data,(float *)right->data);
          if (bVar68) goto LAB_0162aac3;
        }
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = local_4d0->sel_vector;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar46 = (sel_t)iVar35;
          if (psVar13 != (sel_t *)0x0) {
            sVar46 = psVar13[iVar35];
          }
          psVar14[iVar35] = sVar46;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    uVar17 = LStack_490._0_8_;
    uVar20 = LStack_420._0_8_;
    if (LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
LAB_0162a882:
            lVar34 = 0;
          }
          else {
            psVar13 = local_4d0->sel_vector;
            lVar47 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            lVar34 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              uVar62 = uVar50;
              if (lVar47 != 0) {
                uVar62 = (ulong)*(uint *)(lVar47 + uVar50 * 4);
              }
              uVar61 = uVar50;
              if (psVar14 != (sel_t *)0x0) {
                uVar61 = (ulong)psVar14[uVar50];
              }
              bVar68 = GreaterThan::Operation<float>
                                 ((float *)(uVar17 + uVar62 * 4),(float *)(uVar20 + uVar61 * 4));
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar34] = (sel_t)uVar33;
                lVar34 = lVar34 + 1;
              }
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
          }
LAB_0162a884:
          local_4c8 = count - lVar34;
        }
        else {
          if (count == 0) goto LAB_0162536b;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          uVar50 = 0;
          local_4c8 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            uVar62 = uVar50;
            if (lVar47 != 0) {
              uVar62 = (ulong)*(uint *)(lVar47 + uVar50 * 4);
            }
            uVar61 = uVar50;
            if (psVar14 != (sel_t *)0x0) {
              uVar61 = (ulong)psVar14[uVar50];
            }
            bVar68 = GreaterThan::Operation<float>
                               ((float *)(uVar17 + uVar62 * 4),(float *)(uVar20 + uVar61 * 4));
            if (bVar68) {
              (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + 1;
            }
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
        }
      }
      else {
        if (count == 0) goto LAB_0162536b;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4c8 = 0;
        uVar50 = 0;
        iVar35 = 0;
        do {
          uVar33 = uVar50;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar50];
          }
          uVar62 = uVar50;
          if (lVar47 != 0) {
            uVar62 = (ulong)*(uint *)(lVar47 + uVar50 * 4);
          }
          uVar61 = uVar50;
          if (psVar14 != (sel_t *)0x0) {
            uVar61 = (ulong)psVar14[uVar50];
          }
          bVar68 = GreaterThan::Operation<float>
                             ((float *)(uVar17 + uVar62 * 4),(float *)(uVar20 + uVar61 * 4));
          if (bVar68) {
            iVar60 = local_4c8;
            oVar30.ptr = true_sel.ptr;
            iVar49 = iVar35;
            local_4c8 = local_4c8 + 1;
          }
          else {
            iVar49 = iVar35 + 1;
            iVar60 = iVar35;
            oVar30.ptr = false_sel.ptr;
          }
          (oVar30.ptr)->sel_vector[iVar60] = (sel_t)uVar33;
          uVar50 = uVar50 + 1;
          iVar35 = iVar49;
        } while (count != uVar50);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_0162a882;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar34 = 0;
        uVar50 = 0;
        do {
          uVar33 = uVar50;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar50];
          }
          uVar62 = uVar50;
          if (lVar47 != 0) {
            uVar62 = (ulong)*(uint *)(lVar47 + uVar50 * 4);
          }
          uVar61 = uVar50;
          if (psVar14 != (sel_t *)0x0) {
            uVar61 = (ulong)psVar14[uVar50];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar62 >> 6) * 8) >> (uVar62 & 0x3f) & 1) != 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar61 >> 6] >> (uVar61 & 0x3f) & 1)
                     == 0;
          }
          if (bVar68 && !bVar69) {
            bVar68 = GreaterThan::Operation<float>
                               ((float *)(uVar17 + uVar62 * 4),(float *)(uVar20 + uVar61 * 4));
          }
          if (!bVar68) {
            (false_sel.ptr)->sel_vector[lVar34] = (sel_t)uVar33;
            lVar34 = lVar34 + 1;
          }
          uVar50 = uVar50 + 1;
        } while (count != uVar50);
        goto LAB_0162a884;
      }
      if (count == 0) goto LAB_0162536b;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      uVar50 = 0;
      local_4c8 = 0;
      do {
        uVar33 = uVar50;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar50];
        }
        uVar62 = uVar50;
        if (lVar47 != 0) {
          uVar62 = (ulong)*(uint *)(lVar47 + uVar50 * 4);
        }
        uVar61 = uVar50;
        if (psVar14 != (sel_t *)0x0) {
          uVar61 = (ulong)psVar14[uVar50];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (uVar62 >> 6) * 8) >> (uVar62 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[uVar61 >> 6] >> (uVar61 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          bVar68 = GreaterThan::Operation<float>
                             ((float *)(uVar17 + uVar62 * 4),(float *)(uVar20 + uVar61 * 4));
          if (bVar68) goto LAB_0162422a;
        }
        else if (bVar68) {
LAB_0162422a:
          (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
          local_4c8 = local_4c8 + 1;
        }
        uVar50 = uVar50 + 1;
      } while (count != uVar50);
    }
    else {
      if (count == 0) goto LAB_0162536b;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4c8 = 0;
      uVar50 = 0;
      iVar35 = 0;
      do {
        uVar33 = uVar50;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar50];
        }
        uVar62 = uVar50;
        if (lVar47 != 0) {
          uVar62 = (ulong)*(uint *)(lVar47 + uVar50 * 4);
        }
        uVar61 = uVar50;
        if (psVar14 != (sel_t *)0x0) {
          uVar61 = (ulong)psVar14[uVar50];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (uVar62 >> 6) * 8) >> (uVar62 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[uVar61 >> 6] >> (uVar61 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          bVar68 = GreaterThan::Operation<float>
                             ((float *)(uVar17 + uVar62 * 4),(float *)(uVar20 + uVar61 * 4));
          if (bVar68) goto LAB_01621fa7;
LAB_01621fda:
          iVar49 = iVar35 + 1;
          iVar60 = iVar35;
          oVar30.ptr = false_sel.ptr;
        }
        else {
          if (!bVar68) goto LAB_01621fda;
LAB_01621fa7:
          iVar60 = local_4c8;
          oVar30.ptr = true_sel.ptr;
          iVar49 = iVar35;
          local_4c8 = local_4c8 + 1;
        }
        (oVar30.ptr)->sel_vector[iVar60] = (sel_t)uVar33;
        uVar50 = uVar50 + 1;
        iVar35 = iVar49;
      } while (count != uVar50);
    }
    goto LAB_0162a891;
  case DOUBLE:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4d0 = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,local_4d0,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,local_4d0,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar41 = (double *)left->data;
        pdVar64 = (double *)right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = GreaterThan::Operation<double>(pdVar41,pdVar64);
              bVar36 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
            pdVar41 = pdVar41 + 1;
            pdVar64 = pdVar64 + 1;
          } while (count != uVar50);
          return local_4c8;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          uVar50 = 0;
          local_4c8 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              bVar68 = GreaterThan::Operation<double>(pdVar41,pdVar64);
            }
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            uVar50 = uVar50 + 1;
            pdVar41 = pdVar41 + 1;
            pdVar64 = pdVar64 + 1;
          } while (count != uVar50);
          return local_4c8;
        }
        if (count != 0) {
          lVar47 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = false;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (!bVar69 && bVar68 == false) {
              bVar68 = GreaterThan::Operation<double>(pdVar41,pdVar64);
              bVar68 = !bVar68;
            }
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar68;
            uVar50 = uVar50 + 1;
            pdVar41 = pdVar41 + 1;
            pdVar64 = pdVar64 + 1;
          } while (count != uVar50);
          goto LAB_0162bf1b;
        }
        goto LAB_0162bf18;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar41 = (double *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar64 = (double *)left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162ce34;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (local_4d0->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)local_4d0->sel_vector[uVar50];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = GreaterThan::Operation<double>(pdVar64,pdVar41);
                bVar68 = !bVar68;
              }
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
              pdVar64 = pdVar64 + 1;
            } while (count != uVar50);
            goto LAB_0162ce37;
          }
          if (count != 0) {
            uVar50 = 0;
            local_4c8 = 0;
            do {
              uVar33 = uVar50;
              if (local_4d0->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)local_4d0->sel_vector[uVar50];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = GreaterThan::Operation<double>(pdVar64,pdVar41);
              }
              (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
              pdVar64 = pdVar64 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar50);
            goto LAB_0162d073;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = GreaterThan::Operation<double>(pdVar64,pdVar41);
              bVar36 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
            pdVar64 = pdVar64 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar50);
          goto LAB_0162d073;
        }
        goto LAB_0162962c;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar41 = (double *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar64 = (double *)right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162cec8;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (local_4d0->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)local_4d0->sel_vector[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = false;
              }
              else {
                bVar68 = (*(byte *)local_498 & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (!bVar69 && bVar68 == false) {
                bVar68 = GreaterThan::Operation<double>(pdVar41,pdVar64);
                bVar68 = !bVar68;
              }
              (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)bVar68;
              uVar50 = uVar50 + 1;
              pdVar64 = pdVar64 + 1;
            } while (count != uVar50);
            goto LAB_0162cecb;
          }
          if (count != 0) {
            uVar50 = 0;
            local_4c8 = 0;
            do {
              uVar33 = uVar50;
              if (local_4d0->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)local_4d0->sel_vector[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                bVar68 = GreaterThan::Operation<double>(pdVar41,pdVar64);
              }
              (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
              pdVar64 = pdVar64 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar50);
            goto LAB_0162d073;
          }
        }
        else if (count != 0) {
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (local_4d0->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)local_4d0->sel_vector[uVar50];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            bVar36 = (bool)(bVar68 ^ 1);
            if (!bVar69 && bVar36 == false) {
              bVar68 = GreaterThan::Operation<double>(pdVar41,pdVar64);
              bVar36 = !bVar68;
            }
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            (false_sel.ptr)->sel_vector[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)bVar36;
            uVar50 = uVar50 + 1;
            pdVar64 = pdVar64 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar50);
          goto LAB_0162d073;
        }
        goto LAB_0162962c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar69 | bVar68)) {
          if (!bVar68) {
LAB_0162acbb:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (true_sel.ptr)->sel_vector;
              iVar35 = 0;
              do {
                sVar46 = (sel_t)iVar35;
                if (psVar13 != (sel_t *)0x0) {
                  sVar46 = psVar13[iVar35];
                }
                psVar14[iVar35] = sVar46;
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              return count;
            }
            return count;
          }
        }
        else {
          bVar68 = GreaterThan::Operation<double>((double *)left->data,(double *)right->data);
          if (bVar68) goto LAB_0162acbb;
        }
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = local_4d0->sel_vector;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar46 = (sel_t)iVar35;
          if (psVar13 != (sel_t *)0x0) {
            sVar46 = psVar13[iVar35];
          }
          psVar14[iVar35] = sVar46;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    uVar17 = LStack_490._0_8_;
    uVar20 = LStack_420._0_8_;
    if (LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_0162a882;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          lVar34 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            uVar62 = uVar50;
            if (lVar47 != 0) {
              uVar62 = (ulong)*(uint *)(lVar47 + uVar50 * 4);
            }
            uVar61 = uVar50;
            if (psVar14 != (sel_t *)0x0) {
              uVar61 = (ulong)psVar14[uVar50];
            }
            bVar68 = GreaterThan::Operation<double>
                               ((double *)(uVar17 + uVar62 * 8),(double *)(uVar20 + uVar61 * 8));
            if (!bVar68) {
              (false_sel.ptr)->sel_vector[lVar34] = (sel_t)uVar33;
              lVar34 = lVar34 + 1;
            }
            uVar50 = uVar50 + 1;
          } while (count != uVar50);
          goto LAB_0162a884;
        }
        if (count == 0) goto LAB_0162536b;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        uVar50 = 0;
        local_4c8 = 0;
        do {
          uVar33 = uVar50;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar50];
          }
          uVar62 = uVar50;
          if (lVar47 != 0) {
            uVar62 = (ulong)*(uint *)(lVar47 + uVar50 * 4);
          }
          uVar61 = uVar50;
          if (psVar14 != (sel_t *)0x0) {
            uVar61 = (ulong)psVar14[uVar50];
          }
          bVar68 = GreaterThan::Operation<double>
                             ((double *)(uVar17 + uVar62 * 8),(double *)(uVar20 + uVar61 * 8));
          if (bVar68) {
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + 1;
          }
          uVar50 = uVar50 + 1;
        } while (count != uVar50);
      }
      else {
        if (count == 0) goto LAB_0162536b;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        local_4c8 = 0;
        uVar50 = 0;
        iVar35 = 0;
        do {
          uVar33 = uVar50;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar50];
          }
          uVar62 = uVar50;
          if (lVar47 != 0) {
            uVar62 = (ulong)*(uint *)(lVar47 + uVar50 * 4);
          }
          uVar61 = uVar50;
          if (psVar14 != (sel_t *)0x0) {
            uVar61 = (ulong)psVar14[uVar50];
          }
          bVar68 = GreaterThan::Operation<double>
                             ((double *)(uVar17 + uVar62 * 8),(double *)(uVar20 + uVar61 * 8));
          if (bVar68) {
            iVar60 = local_4c8;
            oVar30.ptr = true_sel.ptr;
            iVar49 = iVar35;
            local_4c8 = local_4c8 + 1;
          }
          else {
            iVar49 = iVar35 + 1;
            iVar60 = iVar35;
            oVar30.ptr = false_sel.ptr;
          }
          (oVar30.ptr)->sel_vector[iVar60] = (sel_t)uVar33;
          uVar50 = uVar50 + 1;
          iVar35 = iVar49;
        } while (count != uVar50);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_0162a882;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        lVar34 = 0;
        uVar50 = 0;
        do {
          uVar33 = uVar50;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar50];
          }
          uVar62 = uVar50;
          if (lVar47 != 0) {
            uVar62 = (ulong)*(uint *)(lVar47 + uVar50 * 4);
          }
          uVar61 = uVar50;
          if (psVar14 != (sel_t *)0x0) {
            uVar61 = (ulong)psVar14[uVar50];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar62 >> 6) * 8) >> (uVar62 & 0x3f) & 1) != 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar61 >> 6] >> (uVar61 & 0x3f) & 1)
                     == 0;
          }
          if (bVar68 && !bVar69) {
            bVar68 = GreaterThan::Operation<double>
                               ((double *)(uVar17 + uVar62 * 8),(double *)(uVar20 + uVar61 * 8));
          }
          if (!bVar68) {
            (false_sel.ptr)->sel_vector[lVar34] = (sel_t)uVar33;
            lVar34 = lVar34 + 1;
          }
          uVar50 = uVar50 + 1;
        } while (count != uVar50);
        goto LAB_0162a884;
      }
      if (count == 0) goto LAB_0162536b;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      uVar50 = 0;
      local_4c8 = 0;
      do {
        uVar33 = uVar50;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar50];
        }
        uVar62 = uVar50;
        if (lVar47 != 0) {
          uVar62 = (ulong)*(uint *)(lVar47 + uVar50 * 4);
        }
        uVar61 = uVar50;
        if (psVar14 != (sel_t *)0x0) {
          uVar61 = (ulong)psVar14[uVar50];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (uVar62 >> 6) * 8) >> (uVar62 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[uVar61 >> 6] >> (uVar61 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          bVar68 = GreaterThan::Operation<double>
                             ((double *)(uVar17 + uVar62 * 8),(double *)(uVar20 + uVar61 * 8));
          if (bVar68) goto LAB_0162471d;
        }
        else if (bVar68) {
LAB_0162471d:
          (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)uVar33;
          local_4c8 = local_4c8 + 1;
        }
        uVar50 = uVar50 + 1;
      } while (count != uVar50);
    }
    else {
      if (count == 0) goto LAB_0162536b;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_4c8 = 0;
      uVar50 = 0;
      iVar35 = 0;
      do {
        uVar33 = uVar50;
        if (psVar13 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar13[uVar50];
        }
        uVar62 = uVar50;
        if (lVar47 != 0) {
          uVar62 = (ulong)*(uint *)(lVar47 + uVar50 * 4);
        }
        uVar61 = uVar50;
        if (psVar14 != (sel_t *)0x0) {
          uVar61 = (ulong)psVar14[uVar50];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (uVar62 >> 6) * 8) >> (uVar62 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[uVar61 >> 6] >> (uVar61 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          bVar68 = GreaterThan::Operation<double>
                             ((double *)(uVar17 + uVar62 * 8),(double *)(uVar20 + uVar61 * 8));
          if (bVar68) goto LAB_016222ba;
LAB_016222ed:
          iVar49 = iVar35 + 1;
          iVar60 = iVar35;
          oVar30.ptr = false_sel.ptr;
        }
        else {
          if (!bVar68) goto LAB_016222ed;
LAB_016222ba:
          iVar60 = local_4c8;
          oVar30.ptr = true_sel.ptr;
          iVar49 = iVar35;
          local_4c8 = local_4c8 + 1;
        }
        (oVar30.ptr)->sel_vector[iVar60] = (sel_t)uVar33;
        uVar50 = uVar50 + 1;
        iVar35 = iVar49;
      } while (count != uVar50);
    }
    goto LAB_0162a891;
  case INTERVAL:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_4d0 = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,local_4d0,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,local_4d0,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar10 = left->data;
        pdVar12 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return 0;
          }
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar34 = 8;
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              lVar55 = (long)*(int *)(pdVar10 + lVar34 + -4) +
                       *(long *)(pdVar10 + lVar34) / 86400000000;
              lVar67 = (long)*(int *)(pdVar10 + lVar34 + -8) + lVar55 / 0x1e;
              lVar53 = (long)*(int *)(pdVar12 + lVar34 + -4) +
                       *(long *)(pdVar12 + lVar34) / 86400000000;
              lVar59 = (long)*(int *)(pdVar12 + lVar34 + -8) + lVar53 / 0x1e;
              bVar68 = true;
              if (lVar67 <= lVar59) {
                if (lVar67 < lVar59) {
                  bVar68 = false;
                }
                else {
                  lVar55 = lVar55 % 0x1e;
                  lVar53 = lVar53 % 0x1e;
                  if (lVar55 <= lVar53) {
                    bVar68 = *(long *)(pdVar12 + lVar34) % 86400000000 <
                             *(long *)(pdVar10 + lVar34) % 86400000000 && lVar53 <= lVar55;
                  }
                }
              }
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar50 = uVar50 + 1;
            lVar34 = lVar34 + 0x10;
          } while (count != uVar50);
          return local_4c8;
        }
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            lVar47 = 0;
          }
          else {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            lVar34 = 8;
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (puVar3 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                lVar55 = (long)*(int *)(pdVar10 + lVar34 + -4) +
                         *(long *)(pdVar10 + lVar34) / 86400000000;
                lVar67 = (long)*(int *)(pdVar10 + lVar34 + -8) + lVar55 / 0x1e;
                lVar53 = (long)*(int *)(pdVar12 + lVar34 + -4) +
                         *(long *)(pdVar12 + lVar34) / 86400000000;
                lVar59 = (long)*(int *)(pdVar12 + lVar34 + -8) + lVar53 / 0x1e;
                bVar68 = true;
                if (lVar67 <= lVar59) {
                  if (lVar67 < lVar59) {
                    bVar68 = false;
                  }
                  else {
                    lVar55 = lVar55 % 0x1e;
                    lVar53 = lVar53 % 0x1e;
                    if (lVar55 <= lVar53) {
                      bVar68 = *(long *)(pdVar12 + lVar34) % 86400000000 <
                               *(long *)(pdVar10 + lVar34) % 86400000000 && lVar53 <= lVar55;
                    }
                  }
                }
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar50 = uVar50 + 1;
              lVar34 = lVar34 + 0x10;
            } while (count != uVar50);
          }
          return count - lVar47;
        }
        if (count == 0) {
          return 0;
        }
        psVar13 = local_4d0->sel_vector;
        psVar14 = (true_sel.ptr)->sel_vector;
        lVar47 = 8;
        uVar50 = 0;
        local_4c8 = 0;
        do {
          uVar33 = uVar50;
          if (psVar13 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar13[uVar50];
          }
          if (puVar2 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
          }
          if (puVar3 == (unsigned_long *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = (puVar3[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
          }
          if (bVar68 == true && !bVar69) {
            lVar53 = (long)*(int *)(pdVar10 + lVar47 + -4) +
                     *(long *)(pdVar10 + lVar47) / 86400000000;
            lVar59 = (long)*(int *)(pdVar10 + lVar47 + -8) + lVar53 / 0x1e;
            lVar34 = (long)*(int *)(pdVar12 + lVar47 + -4) +
                     *(long *)(pdVar12 + lVar47) / 86400000000;
            lVar55 = (long)*(int *)(pdVar12 + lVar47 + -8) + lVar34 / 0x1e;
            bVar68 = true;
            if (lVar59 <= lVar55) {
              if (lVar59 < lVar55) {
                bVar68 = false;
              }
              else {
                lVar53 = lVar53 % 0x1e;
                lVar34 = lVar34 % 0x1e;
                if (lVar53 <= lVar34) {
                  bVar68 = *(long *)(pdVar12 + lVar47) % 86400000000 <
                           *(long *)(pdVar10 + lVar47) % 86400000000 && lVar34 <= lVar53;
                }
              }
            }
          }
          psVar14[local_4c8] = (sel_t)uVar33;
          local_4c8 = local_4c8 + bVar68;
          uVar50 = uVar50 + 1;
          lVar47 = lVar47 + 0x10;
        } while (count != uVar50);
        return local_4c8;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar57 = (int *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_478._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_0162d05e:
              lVar47 = 0;
            }
            else {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (false_sel.ptr)->sel_vector;
              plVar44 = (long *)(pdVar10 + 8);
              lVar47 = 0;
              uVar50 = 0;
              do {
                uVar33 = uVar50;
                if (psVar13 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar13[uVar50];
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar69 = false;
                }
                else {
                  bVar69 = (*(byte *)local_498 & 1) == 0;
                }
                if (bVar68 == true && !bVar69) {
                  lVar55 = (long)*(int *)((long)plVar44 + -4) + *plVar44 / 86400000000;
                  lVar53 = (long)(int)plVar44[-1] + lVar55 / 0x1e;
                  lVar34 = (long)piVar57[1] + *(long *)(piVar57 + 2) / 86400000000;
                  lVar59 = (long)*piVar57 + lVar34 / 0x1e;
                  bVar68 = true;
                  if (lVar53 <= lVar59) {
                    if (lVar53 < lVar59) {
                      bVar68 = false;
                    }
                    else {
                      lVar55 = lVar55 % 0x1e;
                      lVar34 = lVar34 % 0x1e;
                      if (lVar55 <= lVar34) {
                        bVar68 = *(long *)(piVar57 + 2) % 86400000000 < *plVar44 % 86400000000 &&
                                 lVar34 <= lVar55;
                      }
                    }
                  }
                }
                psVar14[lVar47] = (sel_t)uVar33;
                lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
                uVar50 = uVar50 + 1;
                plVar44 = plVar44 + 2;
              } while (count != uVar50);
            }
LAB_0162d061:
            local_4c8 = count - lVar47;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            goto LAB_0162d073;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            plVar44 = (long *)(pdVar10 + 8);
            uVar50 = 0;
            local_4c8 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (*(byte *)local_498 & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                lVar53 = (long)*(int *)((long)plVar44 + -4) + *plVar44 / 86400000000;
                lVar34 = (long)(int)plVar44[-1] + lVar53 / 0x1e;
                lVar47 = (long)piVar57[1] + *(long *)(piVar57 + 2) / 86400000000;
                lVar55 = (long)*piVar57 + lVar47 / 0x1e;
                bVar68 = true;
                if (lVar34 <= lVar55) {
                  if (lVar34 < lVar55) {
                    bVar68 = false;
                  }
                  else {
                    lVar53 = lVar53 % 0x1e;
                    lVar47 = lVar47 % 0x1e;
                    if (lVar53 <= lVar47) {
                      bVar68 = *(long *)(piVar57 + 2) % 86400000000 < *plVar44 % 86400000000 &&
                               lVar47 <= lVar53;
                    }
                  }
                }
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
              plVar44 = plVar44 + 2;
            } while (count != uVar50);
            goto LAB_0162d073;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          local_3c0 = (element_type *)(false_sel.ptr)->sel_vector;
          plVar44 = (long *)(pdVar10 + 8);
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) != 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (*(byte *)local_498 & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              lVar55 = (long)*(int *)((long)plVar44 + -4) + *plVar44 / 86400000000;
              lVar53 = (long)(int)plVar44[-1] + lVar55 / 0x1e;
              lVar34 = (long)piVar57[1] + *(long *)(piVar57 + 2) / 86400000000;
              lVar59 = (long)*piVar57 + lVar34 / 0x1e;
              bVar68 = true;
              if (lVar53 <= lVar59) {
                if (lVar53 < lVar59) {
                  bVar68 = false;
                }
                else {
                  lVar55 = lVar55 % 0x1e;
                  lVar34 = lVar34 % 0x1e;
                  if (lVar55 <= lVar34) {
                    bVar68 = *(long *)(piVar57 + 2) % 86400000000 < *plVar44 % 86400000000 &&
                             lVar34 <= lVar55;
                  }
                }
              }
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            *(sel_t *)((long)&local_3c0->_vptr_ExtraTypeInfo + lVar47 * 4) = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar50 = uVar50 + 1;
            plVar44 = plVar44 + 2;
          } while (count != uVar50);
          goto LAB_0162d073;
        }
LAB_0162962c:
        local_4c8 = 0;
        local_478._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        goto LAB_0162d073;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar57 = (int *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar10 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_2f8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2f8);
          peVar18 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar16 = _local_428;
          local_428[0] = auVar19[0];
          local_428[1] = auVar19[1];
          local_428._2_6_ = auVar19._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar16;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar32->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_478._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_0162d05e;
            psVar13 = local_4d0->sel_vector;
            psVar14 = (false_sel.ptr)->sel_vector;
            plVar44 = (long *)(pdVar10 + 8);
            lVar47 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                lVar53 = (long)piVar57[1] + *(long *)(piVar57 + 2) / 86400000000;
                lVar59 = (long)*piVar57 + lVar53 / 0x1e;
                lVar34 = (long)*(int *)((long)plVar44 + -4) + *plVar44 / 86400000000;
                lVar55 = (long)(int)plVar44[-1] + lVar34 / 0x1e;
                bVar68 = true;
                if (lVar59 <= lVar55) {
                  if (lVar59 < lVar55) {
                    bVar68 = false;
                  }
                  else {
                    lVar53 = lVar53 % 0x1e;
                    lVar34 = lVar34 % 0x1e;
                    if (lVar53 <= lVar34) {
                      bVar68 = *plVar44 % 86400000000 < *(long *)(piVar57 + 2) % 86400000000 &&
                               lVar34 <= lVar53;
                    }
                  }
                }
              }
              psVar14[lVar47] = (sel_t)uVar33;
              lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
              uVar50 = uVar50 + 1;
              plVar44 = plVar44 + 2;
            } while (count != uVar50);
            goto LAB_0162d061;
          }
          if (count != 0) {
            psVar13 = local_4d0->sel_vector;
            psVar14 = (true_sel.ptr)->sel_vector;
            plVar44 = (long *)(pdVar10 + 8);
            uVar50 = 0;
            local_4c8 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_498 & 1);
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar69 = false;
              }
              else {
                bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
              }
              if (bVar68 == true && !bVar69) {
                lVar34 = (long)piVar57[1] + *(long *)(piVar57 + 2) / 86400000000;
                lVar55 = (long)*piVar57 + lVar34 / 0x1e;
                lVar47 = (long)*(int *)((long)plVar44 + -4) + *plVar44 / 86400000000;
                lVar53 = (long)(int)plVar44[-1] + lVar47 / 0x1e;
                bVar68 = true;
                if (lVar55 <= lVar53) {
                  if (lVar55 < lVar53) {
                    bVar68 = false;
                  }
                  else {
                    lVar34 = lVar34 % 0x1e;
                    lVar47 = lVar47 % 0x1e;
                    if (lVar34 <= lVar47) {
                      bVar68 = *plVar44 % 86400000000 < *(long *)(piVar57 + 2) % 86400000000 &&
                               lVar47 <= lVar34;
                    }
                  }
                }
              }
              psVar14[local_4c8] = (sel_t)uVar33;
              local_4c8 = local_4c8 + bVar68;
              uVar50 = uVar50 + 1;
              plVar44 = plVar44 + 2;
            } while (count != uVar50);
            goto LAB_0162d073;
          }
        }
        else if (count != 0) {
          psVar13 = local_4d0->sel_vector;
          psVar14 = (true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          plVar44 = (long *)(pdVar10 + 8);
          lVar47 = 0;
          local_4c8 = 0;
          uVar50 = 0;
          do {
            uVar33 = uVar50;
            if (psVar13 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar13[uVar50];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_498 & 1);
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = (puVar2[uVar50 >> 6] >> (uVar50 & 0x3f) & 1) == 0;
            }
            if (bVar68 == true && !bVar69) {
              lVar53 = (long)piVar57[1] + *(long *)(piVar57 + 2) / 86400000000;
              lVar59 = (long)*piVar57 + lVar53 / 0x1e;
              lVar34 = (long)*(int *)((long)plVar44 + -4) + *plVar44 / 86400000000;
              lVar55 = (long)(int)plVar44[-1] + lVar34 / 0x1e;
              bVar68 = true;
              if (lVar59 <= lVar55) {
                if (lVar59 < lVar55) {
                  bVar68 = false;
                }
                else {
                  lVar53 = lVar53 % 0x1e;
                  lVar34 = lVar34 % 0x1e;
                  if (lVar53 <= lVar34) {
                    bVar68 = *plVar44 % 86400000000 < *(long *)(piVar57 + 2) % 86400000000 &&
                             lVar34 <= lVar53;
                  }
                }
              }
            }
            psVar14[local_4c8] = (sel_t)uVar33;
            local_4c8 = local_4c8 + bVar68;
            psVar11[lVar47] = (sel_t)uVar33;
            lVar47 = lVar47 + (ulong)(bVar68 ^ 1);
            uVar50 = uVar50 + 1;
            plVar44 = plVar44 + 2;
          } while (count != uVar50);
          goto LAB_0162d073;
        }
        goto LAB_0162962c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = (*puVar3 & 1) == 0;
        }
        if ((bool)(bVar69 | bVar68)) {
          if (!bVar68) {
LAB_0162ac5b:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar13 = local_4d0->sel_vector;
              psVar14 = (true_sel.ptr)->sel_vector;
              iVar35 = 0;
              do {
                sVar46 = (sel_t)iVar35;
                if (psVar13 != (sel_t *)0x0) {
                  sVar46 = psVar13[iVar35];
                }
                psVar14[iVar35] = sVar46;
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              return count;
            }
            return count;
          }
        }
        else {
          piVar57 = (int *)left->data;
          piVar58 = (int *)right->data;
          lVar47 = (long)piVar57[1] + *(long *)(piVar57 + 2) / 86400000000;
          lVar53 = lVar47 % 0x1e;
          lVar55 = (long)*piVar57 + lVar47 / 0x1e;
          lVar34 = (long)piVar58[1] + *(long *)(piVar58 + 2) / 86400000000;
          lVar47 = lVar34 % 0x1e;
          lVar34 = (long)*piVar58 + lVar34 / 0x1e;
          if ((lVar34 < lVar55) ||
             ((lVar34 <= lVar55 &&
              ((lVar47 < lVar53 ||
               ((lVar47 <= lVar53 &&
                (*(long *)(piVar58 + 2) % 86400000000 < *(long *)(piVar57 + 2) % 86400000000))))))))
          goto LAB_0162ac5b;
        }
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        psVar13 = local_4d0->sel_vector;
        psVar14 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar46 = (sel_t)iVar35;
          if (psVar13 != (sel_t *)0x0) {
            sVar46 = psVar13[iVar35];
          }
          psVar14[iVar35] = sVar46;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    local_3c0 = LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            local_4a0 = 0;
          }
          else {
            psVar13 = local_4d0->sel_vector;
            lVar47 = *(long *)local_498;
            psVar14 = *(sel_t **)local_428;
            local_4a0 = 0;
            uVar50 = 0;
            do {
              uVar33 = uVar50;
              if (psVar13 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar13[uVar50];
              }
              uVar62 = uVar50;
              if (lVar47 != 0) {
                uVar62 = (ulong)*(uint *)(lVar47 + uVar50 * 4);
              }
              uVar61 = uVar50;
              if (psVar14 != (sel_t *)0x0) {
                uVar61 = (ulong)psVar14[uVar50];
              }
              lVar55 = uVar61 * 0x10;
              lVar34 = (long)*(int *)(LStack_490._0_8_ + uVar62 * 0x10 + 4) +
                       *(long *)(LStack_490._0_8_ + (uVar62 * 2 + 1) * 8) / 86400000000;
              lVar59 = lVar34 % 0x1e;
              lVar67 = (long)*(int *)(LStack_490._0_8_ + uVar62 * 0x10) + lVar34 / 0x1e;
              lVar53 = (long)*(int *)(LStack_420._0_8_ + lVar55 + 4) +
                       *(long *)(LStack_420._0_8_ + lVar55 + 8) / 86400000000;
              lVar34 = lVar53 % 0x1e;
              lVar53 = (long)*(int *)(LStack_420._0_8_ + lVar55) + lVar53 / 0x1e;
              if ((lVar67 <= lVar53) &&
                 ((lVar67 < lVar53 ||
                  ((lVar59 <= lVar34 &&
                   ((lVar59 < lVar34 ||
                    (*(long *)(LStack_490._0_8_ + (uVar62 * 2 + 1) * 8) % 86400000000 <=
                     *(long *)(LStack_420._0_8_ + lVar55 + 8) % 86400000000)))))))) {
                (false_sel.ptr)->sel_vector[local_4a0] = (sel_t)uVar33;
                local_4a0 = local_4a0 + 1;
              }
              uVar50 = uVar50 + 1;
            } while (count != uVar50);
          }
          local_4c8 = count - local_4a0;
        }
        else {
          if (count == 0) goto LAB_0162536b;
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          iVar35 = 0;
          local_4c8 = 0;
          do {
            iVar60 = iVar35;
            if (psVar13 != (sel_t *)0x0) {
              iVar60 = (idx_t)psVar13[iVar35];
            }
            iVar49 = iVar35;
            if (lVar47 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
            }
            iVar48 = iVar35;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar35];
            }
            lVar55 = iVar48 * 0x10;
            lVar34 = (long)*(int *)(LStack_490._0_8_ + iVar49 * 0x10 + 4) +
                     *(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8) / 86400000000;
            lVar59 = lVar34 % 0x1e;
            lVar67 = (long)*(int *)(LStack_490._0_8_ + iVar49 * 0x10) + lVar34 / 0x1e;
            lVar53 = (long)*(int *)(LStack_420._0_8_ + lVar55 + 4) +
                     *(long *)(LStack_420._0_8_ + lVar55 + 8) / 86400000000;
            lVar34 = lVar53 % 0x1e;
            lVar53 = (long)*(int *)(LStack_420._0_8_ + lVar55) + lVar53 / 0x1e;
            if ((lVar53 < lVar67) ||
               ((lVar53 <= lVar67 &&
                ((lVar34 < lVar59 ||
                 ((lVar34 <= lVar59 &&
                  (*(long *)(LStack_420._0_8_ + lVar55 + 8) % 86400000000 <
                   *(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8) % 86400000000)))))))) {
              (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
              local_4c8 = local_4c8 + 1;
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
      }
      else if (count == 0) {
LAB_0162536b:
        local_4c8 = 0;
      }
      else {
        local_3c0 = (element_type *)local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar13 = *(sel_t **)local_428;
        local_3b0 = 0;
        local_4c8 = 0;
        iVar35 = 0;
        do {
          iVar60 = iVar35;
          if (local_3c0 != (element_type *)0x0) {
            iVar60 = (idx_t)*(uint *)((long)&local_3c0->_vptr_ExtraTypeInfo + iVar35 * 4);
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar13[iVar35];
          }
          lVar67 = iVar48 * 0x10;
          lVar34 = (long)*(int *)(LStack_490._0_8_ + iVar49 * 0x10 + 4) +
                   *(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8) / 86400000000;
          lVar59 = lVar34 % 0x1e;
          lVar55 = (long)*(int *)(LStack_490._0_8_ + iVar49 * 0x10) + lVar34 / 0x1e;
          lVar53 = (long)*(int *)(LStack_420._0_8_ + lVar67 + 4) +
                   *(long *)(LStack_420._0_8_ + lVar67 + 8) / 86400000000;
          lVar34 = lVar53 % 0x1e;
          lVar53 = (long)*(int *)(LStack_420._0_8_ + lVar67) + lVar53 / 0x1e;
          if ((lVar53 < lVar55) ||
             ((lVar53 <= lVar55 &&
              ((lVar34 < lVar59 ||
               ((lVar34 <= lVar59 &&
                (*(long *)(LStack_420._0_8_ + lVar67 + 8) % 86400000000 <
                 *(long *)(LStack_490._0_8_ + (iVar49 * 2 + 1) * 8) % 86400000000)))))))) {
            iVar49 = local_4c8;
            oVar30.ptr = true_sel.ptr;
            local_4c8 = local_4c8 + 1;
          }
          else {
            iVar49 = local_3b0;
            oVar30.ptr = false_sel.ptr;
            local_3b0 = local_3b0 + 1;
          }
          (oVar30.ptr)->sel_vector[iVar49] = (sel_t)iVar60;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) {
          local_4d0 = (SelectionVector *)0x0;
        }
        else {
          psVar13 = local_4d0->sel_vector;
          lVar47 = *(long *)local_498;
          psVar14 = *(sel_t **)local_428;
          local_4d0 = (SelectionVector *)0x0;
          iVar35 = 0;
          do {
            iVar60 = iVar35;
            if (psVar13 != (sel_t *)0x0) {
              iVar60 = (idx_t)psVar13[iVar35];
            }
            iVar49 = iVar35;
            if (lVar47 != 0) {
              iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
            }
            iVar48 = iVar35;
            if (psVar14 != (sel_t *)0x0) {
              iVar48 = (idx_t)psVar14[iVar35];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar69 = false;
            }
            else {
              bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1)
                       == 0;
            }
            if (bVar68 && !bVar69) {
              piVar58 = (int *)(LStack_490._0_8_ + iVar49 * 0x10);
              piVar57 = (int *)(LStack_420._0_8_ + iVar48 * 0x10);
              lVar34 = (long)piVar58[1] + *(long *)(piVar58 + 2) / 86400000000;
              lVar55 = lVar34 % 0x1e;
              lVar59 = (long)*piVar58 + lVar34 / 0x1e;
              lVar53 = (long)piVar57[1] + *(long *)(piVar57 + 2) / 86400000000;
              lVar34 = lVar53 % 0x1e;
              lVar53 = (long)*piVar57 + lVar53 / 0x1e;
              if ((lVar59 <= lVar53) &&
                 ((lVar59 < lVar53 ||
                  ((lVar55 <= lVar34 &&
                   ((lVar55 < lVar34 ||
                    (*(long *)(piVar58 + 2) % 86400000000 <= *(long *)(piVar57 + 2) % 86400000000)))
                   ))))) goto LAB_01629c07;
            }
            else if (!bVar68) {
LAB_01629c07:
              (false_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar60;
              local_4d0 = (SelectionVector *)((long)local_4d0 + 1);
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        local_4c8 = count - (long)local_4d0;
      }
      else {
        if (count == 0) goto LAB_0162536b;
        psVar13 = local_4d0->sel_vector;
        lVar47 = *(long *)local_498;
        psVar14 = *(sel_t **)local_428;
        iVar35 = 0;
        local_4c8 = 0;
        do {
          iVar60 = iVar35;
          if (psVar13 != (sel_t *)0x0) {
            iVar60 = (idx_t)psVar13[iVar35];
          }
          iVar49 = iVar35;
          if (lVar47 != 0) {
            iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
          }
          iVar48 = iVar35;
          if (psVar14 != (sel_t *)0x0) {
            iVar48 = (idx_t)psVar14[iVar35];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1)
                     == 0;
          }
          if (bVar68 && !bVar69) {
            piVar57 = (int *)(LStack_490._0_8_ + iVar49 * 0x10);
            piVar58 = (int *)(LStack_420._0_8_ + iVar48 * 0x10);
            lVar34 = (long)piVar57[1] + *(long *)(piVar57 + 2) / 86400000000;
            lVar55 = lVar34 % 0x1e;
            lVar59 = (long)*piVar57 + lVar34 / 0x1e;
            lVar53 = (long)piVar58[1] + *(long *)(piVar58 + 2) / 86400000000;
            lVar34 = lVar53 % 0x1e;
            lVar53 = (long)*piVar58 + lVar53 / 0x1e;
            if ((lVar53 < lVar59) ||
               ((lVar53 <= lVar59 &&
                ((lVar34 < lVar55 ||
                 ((lVar34 <= lVar55 &&
                  (*(long *)(piVar58 + 2) % 86400000000 < *(long *)(piVar57 + 2) % 86400000000))))))
               )) goto LAB_016245a8;
          }
          else if (bVar68) {
LAB_016245a8:
            (true_sel.ptr)->sel_vector[local_4c8] = (sel_t)iVar60;
            local_4c8 = local_4c8 + 1;
          }
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
      }
    }
    else {
      if (count == 0) goto LAB_0162536b;
      psVar13 = local_4d0->sel_vector;
      lVar47 = *(long *)local_498;
      psVar14 = *(sel_t **)local_428;
      local_3b0 = 0;
      local_4c8 = 0;
      iVar35 = 0;
      do {
        iVar60 = iVar35;
        if (psVar13 != (sel_t *)0x0) {
          iVar60 = (idx_t)psVar13[iVar35];
        }
        iVar49 = iVar35;
        if (lVar47 != 0) {
          iVar49 = (idx_t)*(uint *)(lVar47 + iVar35 * 4);
        }
        iVar48 = iVar35;
        if (psVar14 != (sel_t *)0x0) {
          iVar48 = (idx_t)psVar14[iVar35];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar68 = true;
        }
        else {
          bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar49 >> 6) * 8) >> (iVar49 & 0x3f) & 1) != 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar69 = false;
        }
        else {
          bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar48 >> 6] >> (iVar48 & 0x3f) & 1) == 0
          ;
        }
        if (bVar68 && !bVar69) {
          piVar58 = (int *)(LStack_490._0_8_ + iVar49 * 0x10);
          piVar57 = (int *)(LStack_420._0_8_ + iVar48 * 0x10);
          lVar34 = (long)piVar58[1] + *(long *)(piVar58 + 2) / 86400000000;
          lVar55 = lVar34 % 0x1e;
          lVar59 = (long)*piVar58 + lVar34 / 0x1e;
          lVar53 = (long)piVar57[1] + *(long *)(piVar57 + 2) / 86400000000;
          lVar34 = lVar53 % 0x1e;
          lVar53 = (long)*piVar57 + lVar53 / 0x1e;
          if ((lVar59 <= lVar53) &&
             ((lVar59 < lVar53 ||
              ((lVar55 <= lVar34 &&
               ((lVar55 < lVar34 ||
                (*(long *)(piVar58 + 2) % 86400000000 <= *(long *)(piVar57 + 2) % 86400000000)))))))
             ) goto LAB_016221c6;
LAB_016221ac:
          iVar49 = local_4c8;
          oVar30.ptr = true_sel.ptr;
          local_4c8 = local_4c8 + 1;
        }
        else {
          if (bVar68) goto LAB_016221ac;
LAB_016221c6:
          iVar49 = local_3b0;
          oVar30.ptr = false_sel.ptr;
          local_3b0 = local_3b0 + 1;
        }
        (oVar30.ptr)->sel_vector[iVar49] = (sel_t)iVar60;
        iVar35 = iVar35 + 1;
      } while (count != iVar35);
    }
LAB_0162a891:
    if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
    }
    if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
    }
    if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
    }
LAB_0162d073:
    if ((element_type *)local_478._M_pi != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_478._M_pi);
      return local_4c8;
    }
    return local_4c8;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_218.ptr = false_sel.ptr;
    local_210.ptr = true_sel.ptr;
    local_208.ptr = sel.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_208.ptr = FlatVector::IncrementalSelectionVector();
    }
    SelectionVector::SelectionVector(&local_118,count);
    OptionalSelection::OptionalSelection(&local_150,&local_118);
    SelectionVector::SelectionVector(&local_130,count);
    OptionalSelection::OptionalSelection(&local_1b8,&local_130);
    SelectionVector::SelectionVector(&local_378,count);
    Vector::Vector(&local_100,left);
    Vector::Vector(&local_98,right);
    optional_ptr<const_duckdb::SelectionVector,_true>::CheckValid(&local_208);
    oVar31.ptr = local_208.ptr;
    local_200.sel = (SelectionVector *)null_mask.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(&local_100,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(&local_98,count,(UnifiedVectorFormat *)local_428);
    if (LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (count == 0) {
        local_4a0 = 0;
        uVar50 = 0;
      }
      else {
        psVar13 = (oVar31.ptr)->sel_vector;
        local_4a0 = 0;
        iVar35 = 0;
        do {
          sVar46 = (sel_t)iVar35;
          if (psVar13 != (sel_t *)0x0) {
            sVar46 = psVar13[iVar35];
          }
          *(sel_t *)((long)(sel_t **)local_378.sel_vector + iVar35 * 4) = sVar46;
          iVar35 = iVar35 + 1;
          uVar50 = count;
        } while (count != iVar35);
      }
    }
    else {
      SelectionVector::SelectionVector((SelectionVector *)&local_2f8,count);
      if (count == 0) {
        local_4a0 = 0;
        lVar47 = 0;
        uVar50 = 0;
      }
      else {
        local_4a0 = 0;
        uVar50 = 0;
        uVar33 = 0;
        lVar47 = 0;
        do {
          psVar13 = (oVar31.ptr)->sel_vector;
          uVar62 = uVar33;
          if (psVar13 != (sel_t *)0x0) {
            uVar62 = (ulong)psVar13[uVar33];
          }
          uVar61 = uVar33;
          if (*(long *)local_498 != 0) {
            uVar61 = (ulong)*(uint *)(*(long *)local_498 + uVar33 * 4);
          }
          uVar22 = uVar33;
          if (*(sel_t **)local_428 != (sel_t *)0x0) {
            uVar22 = (ulong)(*(sel_t **)local_428)[uVar33];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar61 >> 6) * 8) >> (uVar61 & 0x3f) & 1) != 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar69 = false;
          }
          else {
            bVar69 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar22 >> 6] >> (uVar22 & 0x3f) & 1)
                     == 0;
          }
          uVar37 = (undefined4)uVar62;
          if ((bool)(bVar68 ^ 1U | bVar69)) {
            if (local_200.sel != (SelectionVector *)0x0) {
              optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                        ((optional_ptr<duckdb::ValidityMask,_true> *)&local_200);
              pSVar21 = local_200.sel;
              _Var23._M_head_impl =
                   ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                   validity_mask;
              if (_Var23._M_head_impl == (unsigned_long *)0x0) {
                local_198.sel = (SelectionVector *)local_200.sel[1].sel_vector;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_288,(unsigned_long *)&local_198);
                auVar19 = local_288;
                uVar17 = aLStack_280[0]._0_8_;
                _local_288 = (undefined1  [16])0x0;
                p_Var26 = (pSVar21->selection_data).internal.
                          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                (pSVar21->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)auVar19;
                (pSVar21->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17;
                if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_280[0]._0_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_280[0]._0_8_)
                    ;
                  }
                }
                pTVar32 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)&pSVar21->selection_data);
                _Var23._M_head_impl =
                     (pTVar32->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                ((TemplatedValidityMask<unsigned_long> *)&pSVar21->sel_vector)->validity_mask =
                     _Var23._M_head_impl;
              }
              bVar15 = (byte)uVar62 & 0x3f;
              _Var23._M_head_impl[uVar62 >> 6] =
                   _Var23._M_head_impl[uVar62 >> 6] &
                   (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
            }
            if (bVar68) {
              if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
                *(undefined4 *)
                 ((long)&((SelectionVector *)(local_150.sel)->sel_vector)->sel_vector +
                 local_4a0 * 4) = uVar37;
              }
              local_4a0 = local_4a0 + 1;
            }
            else {
              if ((OptionalSelection *)local_1b8.sel != (OptionalSelection *)0x0) {
                *(undefined4 *)
                 ((long)&((SelectionVector *)(local_1b8.sel)->sel_vector)->sel_vector + lVar47 * 4)
                     = uVar37;
              }
              lVar47 = lVar47 + 1;
            }
          }
          else {
            *(sel_t *)(local_2f8._0_8_ + uVar50 * 4) = (sel_t)uVar33;
            *(undefined4 *)((long)(sel_t **)local_378.sel_vector + uVar50 * 4) = uVar37;
            uVar50 = uVar50 + 1;
          }
          uVar33 = uVar33 + 1;
        } while (count != uVar33);
      }
      pSVar21 = local_150.sel;
      if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
        pSVar4 = (SelectionVector *)(local_150.sel)->sel_vector;
        p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (((SelectionVector *)&(local_150.sel)->selection_data)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ((local_150.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        ((local_150.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
        }
        pSVar21->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + local_4a0 * 4);
      }
      pSVar21 = local_1b8.sel;
      if ((OptionalSelection *)local_1b8.sel != (OptionalSelection *)0x0) {
        pSVar4 = (SelectionVector *)(local_1b8.sel)->sel_vector;
        p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (((SelectionVector *)&(local_1b8.sel)->selection_data)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ((local_1b8.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        ((local_1b8.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
        }
        pSVar21->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + lVar47 * 4);
      }
      if (uVar50 < count && uVar50 != 0) {
        Vector::Slice(&local_100,(SelectionVector *)&local_2f8,uVar50);
        Vector::Slice(&local_98,(SelectionVector *)&local_2f8,uVar50);
      }
      if (local_2f8.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_2f8.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
    }
    if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
    }
    if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
    }
    if (local_478._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_478._M_pi);
    }
    PVar1 = (left->type).physical_type_;
    if (PVar1 == LIST) {
      local_3b8 = (optional_ptr<duckdb::ValidityMask,_true>)
                  (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
      if (uVar50 == 0) goto LAB_0161f7d5;
      SelectionVector::SelectionVector(&local_390,uVar50);
      SelectionVector::SelectionVector(&local_360,uVar50);
      pVVar24 = ListVector::GetEntry(&local_100);
      Vector::Vector((Vector *)local_498,pVVar24);
      pVVar24 = ListVector::GetEntry(&local_98);
      Vector::Vector((Vector *)local_428,pVVar24);
      iVar35 = ListVector::GetListSize(&local_100);
      Vector::Flatten((Vector *)local_498,iVar35);
      iVar35 = ListVector::GetListSize(&local_98);
      Vector::Flatten((Vector *)local_428,iVar35);
      Vector::Vector(&local_2f8,(Vector *)local_498,&local_390,uVar50);
      Vector::Vector((Vector *)local_288,(Vector *)local_428,&local_360,uVar50);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_198);
      Vector::ToUnifiedFormat(&local_100,uVar50,&local_198);
      pdVar12 = local_198.data;
      UnifiedVectorFormat::UnifiedVectorFormat(&local_200);
      Vector::ToUnifiedFormat(&local_98,uVar50,&local_200);
      pdVar10 = local_200.data;
      SelectionVector::SelectionVector(&local_3a8,uVar50);
      auVar16 = _DAT_01d84390;
      lVar47 = uVar50 - 1;
      auVar72._8_4_ = (int)lVar47;
      auVar72._0_8_ = lVar47;
      auVar72._12_4_ = (int)((ulong)lVar47 >> 0x20);
      uVar33 = 0;
      auVar72 = auVar72 ^ _DAT_01d84390;
      auVar74 = _DAT_01d84380;
      do {
        auVar75 = auVar74 ^ auVar16;
        if ((bool)(~(auVar75._4_4_ == auVar72._4_4_ && auVar72._0_4_ < auVar75._0_4_ ||
                    auVar72._4_4_ < auVar75._4_4_) & 1)) {
          local_3a8.sel_vector[uVar33] = (sel_t)uVar33;
        }
        if ((auVar75._12_4_ != auVar72._12_4_ || auVar75._8_4_ <= auVar72._8_4_) &&
            auVar75._12_4_ <= auVar72._12_4_) {
          local_3a8.sel_vector[uVar33 + 1] = (sel_t)uVar33 + 1;
        }
        uVar33 = uVar33 + 2;
        lVar47 = auVar74._8_8_;
        auVar74._0_8_ = auVar74._0_8_ + 2;
        auVar74._8_8_ = lVar47 + 2;
      } while ((uVar50 + 1 & 0xfffffffffffffffe) != uVar33);
      SelectionVector::SelectionVector(&local_310,uVar50);
      SelectionVector::SelectionVector((SelectionVector *)(local_348 + 0x20),uVar50);
      local_348._0_16_ = (undefined1  [16])0x0;
      local_348._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_348._24_8_ = (element_type *)0x800;
      if (local_3b8.ptr == (ValidityMask *)0x0) {
        local_4a8.ptr = (ValidityMask *)0x0;
      }
      else {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3b8);
        peVar25 = (element_type *)ValidityMask::Capacity(local_3b8.ptr);
        uVar17 = local_348._16_8_;
        local_348._0_16_ = (undefined1  [16])0x0;
        local_348._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17);
        }
        local_4a8.ptr = (ValidityMask *)local_348;
        local_348._24_8_ = peVar25;
      }
      local_4c8 = 0;
      uVar33 = 0;
      do {
        pSVar21 = local_150.sel;
        psVar13 = (local_198.sel)->sel_vector;
        uVar62 = 0;
        do {
          uVar61 = uVar62;
          if (local_3a8.sel_vector != (sel_t *)0x0) {
            uVar61 = (ulong)local_3a8.sel_vector[uVar62];
          }
          if (psVar13 != (sel_t *)0x0) {
            uVar61 = (ulong)psVar13[uVar61];
          }
          iVar38 = (int)uVar33;
          local_390.sel_vector[uVar62] = *(int *)((long)local_198.data + uVar61 * 2 * 8) + iVar38;
          uVar62 = uVar62 + 1;
        } while (uVar50 != uVar62);
        puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                 validity_mask;
        uVar62 = 0;
        do {
          uVar61 = uVar62;
          if (local_3a8.sel_vector != (sel_t *)0x0) {
            uVar61 = (ulong)local_3a8.sel_vector[uVar62];
          }
          if (puVar2 != (unsigned_long *)0x0) {
            uVar61 = (ulong)*(uint *)((long)puVar2 + uVar61 * 4);
          }
          *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_360.sel_vector)->
                          validity_mask + uVar62 * 4) =
               *(int *)(local_200.data + uVar61 * 0x10) + iVar38;
          uVar62 = uVar62 + 1;
        } while (uVar50 != uVar62);
        uVar62 = 0;
        uVar61 = 0;
        local_4c0 = 0;
        lVar47 = 0;
        do {
          uVar22 = uVar62;
          if (local_3a8.sel_vector != (sel_t *)0x0) {
            uVar22 = (ulong)local_3a8.sel_vector[uVar62];
          }
          uVar52 = uVar22;
          if (psVar13 != (sel_t *)0x0) {
            uVar52 = (ulong)psVar13[uVar22];
          }
          uVar54 = uVar22;
          if (puVar2 != (unsigned_long *)0x0) {
            uVar54 = (ulong)*(uint *)((long)puVar2 + uVar22 * 4);
          }
          if ((*(ulong *)((long)pdVar12 + (uVar52 * 2 + 1) * 8) == uVar33) ||
             (*(ulong *)(pdVar10 + uVar54 * 0x10 + 8) == uVar33)) {
            if ((SelectionVector *)local_378.sel_vector != (SelectionVector *)0x0) {
              uVar22 = (ulong)*(uint *)((long)(sel_t **)local_378.sel_vector + uVar22 * 4);
            }
            if (*(ulong *)(pdVar10 + uVar54 * 0x10 + 8) <
                *(ulong *)((long)pdVar12 + (uVar52 * 2 + 1) * 8)) {
              if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
                *(int *)((long)&((SelectionVector *)(local_150.sel)->sel_vector)->sel_vector +
                        local_4c0 * 4) = (int)uVar22;
              }
              local_4c0 = local_4c0 + 1;
            }
            else {
              if ((OptionalSelection *)local_1b8.sel != (OptionalSelection *)0x0) {
                *(int *)((long)&((SelectionVector *)(local_1b8.sel)->sel_vector)->sel_vector +
                        lVar47 * 4) = (int)uVar22;
              }
              lVar47 = lVar47 + 1;
            }
          }
          else {
            *(sel_t *)((long)&(((AllocatedData *)local_310.sel_vector)->allocator).ptr + uVar61 * 4)
                 = (sel_t)uVar22;
            uVar61 = uVar61 + 1;
          }
          uVar62 = uVar62 + 1;
        } while (uVar50 != uVar62);
        if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
          pSVar4 = (SelectionVector *)(local_150.sel)->sel_vector;
          p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((SelectionVector *)&(local_150.sel)->selection_data)->selection_data).internal
                    .super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ((local_150.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          ((local_150.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
          }
          pSVar21->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + local_4c0 * 4);
        }
        pSVar21 = local_1b8.sel;
        if ((OptionalSelection *)local_1b8.sel != (OptionalSelection *)0x0) {
          pSVar4 = (SelectionVector *)(local_1b8.sel)->sel_vector;
          p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((SelectionVector *)&(local_1b8.sel)->selection_data)->selection_data).internal
                    .super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ((local_1b8.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          ((local_1b8.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
          }
          pSVar21->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + lVar47 * 4);
        }
        if (uVar61 < uVar50) {
          if (uVar61 == 0) {
            uVar50 = 0;
          }
          else {
            uVar50 = 0;
            do {
              sVar46 = (sel_t)uVar50;
              if ((element_type *)local_310.sel_vector != (element_type *)0x0) {
                sVar46 = *(sel_t *)((long)&(((AllocatedData *)local_310.sel_vector)->allocator).ptr
                                   + uVar50 * 4);
              }
              local_3a8.sel_vector[uVar50] = sVar46;
              uVar50 = uVar50 + 1;
            } while (uVar61 != uVar50);
            psVar13 = (local_198.sel)->sel_vector;
            uVar50 = 0;
            do {
              uVar62 = uVar50;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar62 = (ulong)local_3a8.sel_vector[uVar50];
              }
              if (psVar13 != (sel_t *)0x0) {
                uVar62 = (ulong)psVar13[uVar62];
              }
              local_390.sel_vector[uVar50] =
                   *(int *)((long)local_198.data + uVar62 * 2 * 8) + iVar38;
              uVar50 = uVar50 + 1;
            } while (uVar61 != uVar50);
            puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                     validity_mask;
            uVar62 = 0;
            do {
              uVar50 = uVar62;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar50 = (ulong)local_3a8.sel_vector[uVar62];
              }
              if (puVar2 != (unsigned_long *)0x0) {
                uVar50 = (ulong)*(uint *)((long)puVar2 + uVar50 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_360.sel_vector)->
                              validity_mask + uVar62 * 4) =
                   *(int *)(local_200.data + uVar50 * 0x10) + iVar38;
              uVar62 = uVar62 + 1;
              uVar50 = uVar61;
            } while (uVar61 != uVar62);
          }
        }
        iVar35 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                           (&local_2f8,(Vector *)local_288,&local_3a8,uVar50,&local_310,
                            (SelectionVector *)(local_348 + 0x20),local_4a8);
        ExtractNestedMask(&local_3a8,uVar50,&local_378,local_4a8.ptr,local_3b8);
        local_4c8 = local_4c0 + local_4c8;
        if (iVar35 != 0) {
          oVar30.ptr = &local_310;
          if (uVar50 == iVar35) {
            oVar30.ptr = &local_3a8;
          }
          ExtractNestedSelection
                    ((SelectionVector *)(oVar30.ptr)->sel_vector,iVar35,
                     (SelectionVector *)local_378.sel_vector,(OptionalSelection *)local_150.sel);
          local_4c8 = local_4c8 + iVar35;
          uVar50 = uVar50 - iVar35;
          if (uVar50 == 0) {
            uVar50 = 0;
          }
          else {
            uVar62 = 0;
            do {
              sVar46 = (sel_t)uVar62;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._32_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                sVar46 = *(sel_t *)((long)(_func_int ***)local_348._32_8_ + uVar62 * 4);
              }
              local_3a8.sel_vector[uVar62] = sVar46;
              uVar62 = uVar62 + 1;
            } while (uVar50 != uVar62);
            psVar13 = (local_198.sel)->sel_vector;
            uVar62 = 0;
            do {
              uVar61 = uVar62;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar61 = (ulong)local_3a8.sel_vector[uVar62];
              }
              if (psVar13 != (sel_t *)0x0) {
                uVar61 = (ulong)psVar13[uVar61];
              }
              local_390.sel_vector[uVar62] =
                   *(int *)((long)local_198.data + uVar61 * 2 * 8) + iVar38;
              uVar62 = uVar62 + 1;
            } while (uVar50 != uVar62);
            puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                     validity_mask;
            uVar62 = 0;
            do {
              uVar61 = uVar62;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar61 = (ulong)local_3a8.sel_vector[uVar62];
              }
              if (puVar2 != (unsigned_long *)0x0) {
                uVar61 = (ulong)*(uint *)((long)puVar2 + uVar61 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_360.sel_vector)->
                              validity_mask + uVar62 * 4) =
                   *(int *)(local_200.data + uVar61 * 0x10) + iVar38;
              uVar62 = uVar62 + 1;
            } while (uVar50 != uVar62);
          }
        }
        iVar35 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                           (&local_2f8,(Vector *)local_288,&local_3a8,uVar50,
                            (SelectionVector *)(local_348 + 0x20),&local_310,local_4a8);
        ExtractNestedMask(&local_3a8,uVar50,&local_378,local_4a8.ptr,local_3b8);
        uVar50 = uVar50 - iVar35;
        oVar31.ptr = (SelectionVector *)(local_348 + 0x20);
        if (uVar50 == 0) {
          oVar31.ptr = &local_3a8;
        }
        ExtractNestedSelection
                  ((SelectionVector *)(oVar31.ptr)->sel_vector,iVar35,
                   (SelectionVector *)local_378.sel_vector,(OptionalSelection *)local_1b8.sel);
        if (iVar35 != 0) {
          if (uVar50 == 0) break;
          uVar62 = 0;
          do {
            sVar46 = (sel_t)uVar62;
            if ((element_type *)local_310.sel_vector != (element_type *)0x0) {
              sVar46 = *(sel_t *)((long)&(((AllocatedData *)local_310.sel_vector)->allocator).ptr +
                                 uVar62 * 4);
            }
            local_3a8.sel_vector[uVar62] = sVar46;
            uVar62 = uVar62 + 1;
          } while (uVar50 != uVar62);
        }
        uVar33 = uVar33 + 1;
      } while (uVar50 != 0);
LAB_01623b54:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_);
      }
      if (local_318 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_318);
      }
      if (local_310.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_310.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_3a8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3a8.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_200.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_200.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_198.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_198.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
      }
      if (local_238._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238._M_pi);
      }
      if (local_250._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_288 + 8));
      if (local_2f8.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2f8.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_2f8.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2f8.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_2f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)((long)&local_2f8 + 8));
      if (local_3c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c8._M_pi);
      }
      if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
      }
      if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_428 + 8));
      if (local_438._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_438._M_pi);
      }
      if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
      }
      if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_498 + 8));
      if (local_360.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_360.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_390.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_390.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    else {
      if (PVar1 == STRUCT) {
        local_360.sel_vector = (sel_t *)null_mask.ptr;
        if (uVar50 != 0) {
          _local_288 = (undefined1  [16])0x0;
          aLStack_280[0].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          local_198.sel = (SelectionVector *)0x0;
          local_198.data = (data_ptr_t)0x0;
          this = StructVector::GetEntries(&local_100);
          this_00 = StructVector::GetEntries(&local_98);
          SelectionVector::SelectionVector((SelectionVector *)&local_200,uVar50);
          auVar16 = _DAT_01d84390;
          lVar47 = uVar50 - 1;
          auVar71._8_4_ = (int)lVar47;
          auVar71._0_8_ = lVar47;
          auVar71._12_4_ = (int)((ulong)lVar47 >> 0x20);
          uVar33 = 0;
          auVar71 = auVar71 ^ _DAT_01d84390;
          auVar75 = _DAT_01d84380;
          do {
            auVar74 = auVar75 ^ auVar16;
            if ((bool)(~(auVar74._4_4_ == auVar71._4_4_ && auVar71._0_4_ < auVar74._0_4_ ||
                        auVar71._4_4_ < auVar74._4_4_) & 1)) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)
                              ->validity_mask + uVar33 * 4) = (int)uVar33;
            }
            if ((auVar74._12_4_ != auVar71._12_4_ || auVar74._8_4_ <= auVar71._8_4_) &&
                auVar74._12_4_ <= auVar71._12_4_) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)
                              ->validity_mask + uVar33 * 4 + 4) = (int)uVar33 + 1;
            }
            uVar33 = uVar33 + 2;
            lVar47 = auVar75._8_8_;
            auVar75._0_8_ = auVar75._0_8_ + 2;
            auVar75._8_8_ = lVar47 + 2;
          } while ((uVar50 + 1 & 0xfffffffffffffffe) != uVar33);
          SelectionVector::SelectionVector((SelectionVector *)local_348,uVar50);
          SelectionVector::SelectionVector(&local_390,uVar50);
          local_2f8.vector_type = FLAT_VECTOR;
          local_2f8._1_7_ = 0;
          local_2f8.type.id_ = INVALID;
          local_2f8.type.physical_type_ = ~INVALID;
          local_2f8.type._2_6_ = 0;
          local_2f8.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_2f8.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((ValidityMask *)local_360.sel_vector == (ValidityMask *)0x0) {
            null_mask_00.ptr = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                      ((optional_ptr<duckdb::ValidityMask,_true> *)&local_360);
            p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ValidityMask::Capacity((ValidityMask *)local_360.sel_vector);
            peVar18 = local_2f8.type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_2f8.vector_type = FLAT_VECTOR;
            local_2f8._1_7_ = 0;
            local_2f8.type.id_ = INVALID;
            local_2f8.type.physical_type_ = ~INVALID;
            local_2f8.type._2_6_ = 0;
            local_2f8.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            if (peVar18 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            }
            null_mask_00.ptr = (ValidityMask *)&local_2f8;
            local_2f8.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = p_Var26;
          }
          if ((this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_4c8 = 0;
          }
          else {
            __n = 0;
            local_4c8 = 0;
            iVar35 = uVar50;
            do {
              pvVar27 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this,__n);
              pVVar28 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar27);
              Vector::Vector((Vector *)local_498,pVVar28);
              Vector::Flatten((Vector *)local_498,uVar50);
              Vector::Slice((Vector *)local_498,(SelectionVector *)&local_200,iVar35);
              pvVar27 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this_00,__n);
              pVVar28 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar27);
              Vector::Vector((Vector *)local_428,pVVar28);
              Vector::Flatten((Vector *)local_428,uVar50);
              Vector::Slice((Vector *)local_428,(SelectionVector *)&local_200,iVar35);
              iVar60 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                                 ((Vector *)local_498,(Vector *)local_428,
                                  (SelectionVector *)&local_200,iVar35,(SelectionVector *)local_348,
                                  &local_390,null_mask_00);
              ExtractNestedMask((SelectionVector *)&local_200,iVar35,&local_378,null_mask_00.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)local_360.sel_vector);
              if (iVar60 != 0) {
                pUVar29 = (UnifiedVectorFormat *)local_348;
                if (iVar35 == iVar60) {
                  pUVar29 = &local_200;
                }
                ExtractNestedSelection
                          (pUVar29->sel,iVar60,(SelectionVector *)local_378.sel_vector,
                           (OptionalSelection *)local_150.sel);
                iVar35 = iVar35 - iVar60;
                if (iVar35 != 0) {
                  iVar49 = 0;
                  do {
                    sVar46 = (sel_t)iVar49;
                    if (local_390.sel_vector != (sel_t *)0x0) {
                      sVar46 = local_390.sel_vector[iVar49];
                    }
                    *(sel_t *)((long)&((TemplatedValidityMask<unsigned_long> *)
                                      &(local_200.sel)->sel_vector)->validity_mask + iVar49 * 4) =
                         sVar46;
                    iVar49 = iVar49 + 1;
                  } while (iVar35 != iVar49);
                }
                local_4c8 = local_4c8 + iVar60;
              }
              if (__n == ((long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
                iVar60 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                                   ((Vector *)local_498,(Vector *)local_428,
                                    (SelectionVector *)&local_200,iVar35,
                                    (SelectionVector *)local_348,&local_390,null_mask_00);
                ExtractNestedMask((SelectionVector *)&local_200,iVar35,&local_378,null_mask_00.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_360.sel_vector);
                oVar31.ptr = (SelectionVector *)local_348;
                if (iVar35 - iVar60 == 0) {
                  oVar31.ptr = (SelectionVector *)&local_200;
                }
                ExtractNestedSelection
                          ((SelectionVector *)(oVar31.ptr)->sel_vector,iVar60,
                           (SelectionVector *)local_378.sel_vector,
                           (OptionalSelection *)local_150.sel);
                oVar31.ptr = &local_390;
                if (iVar60 == 0) {
                  oVar31.ptr = (SelectionVector *)&local_200;
                }
                ExtractNestedSelection
                          ((SelectionVector *)(oVar31.ptr)->sel_vector,iVar35 - iVar60,
                           (SelectionVector *)local_378.sel_vector,
                           (OptionalSelection *)local_1b8.sel);
                local_4c8 = local_4c8 + iVar60;
              }
              else {
                iVar60 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                                   ((Vector *)local_498,(Vector *)local_428,
                                    (SelectionVector *)&local_200,iVar35,&local_390,
                                    (SelectionVector *)local_348,null_mask_00);
                ExtractNestedMask((SelectionVector *)&local_200,iVar35,&local_378,null_mask_00.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_360.sel_vector);
                iVar35 = iVar35 - iVar60;
                oVar31.ptr = &local_390;
                if (iVar35 == 0) {
                  oVar31.ptr = (SelectionVector *)&local_200;
                }
                ExtractNestedSelection
                          ((SelectionVector *)(oVar31.ptr)->sel_vector,iVar60,
                           (SelectionVector *)local_378.sel_vector,
                           (OptionalSelection *)local_1b8.sel);
                if (iVar60 != 0) {
                  if (iVar35 == 0) {
                    iVar35 = 0;
                  }
                  else {
                    iVar60 = 0;
                    do {
                      uVar37 = (undefined4)iVar60;
                      if ((SelectionVector *)local_348._0_8_ != (SelectionVector *)0x0) {
                        uVar37 = *(undefined4 *)((long)(sel_t **)local_348._0_8_ + iVar60 * 4);
                      }
                      *(undefined4 *)
                       ((long)&((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector
                               )->validity_mask + iVar60 * 4) = uVar37;
                      iVar60 = iVar60 + 1;
                    } while (iVar35 != iVar60);
                  }
                }
              }
              if (local_3c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c8._M_pi);
              }
              if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
              }
              if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_428 + 8));
              if (local_438._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_438._M_pi);
              }
              if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
              }
              if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_498 + 8));
              __n = __n + 1;
            } while (__n < (ulong)((long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          if (local_2f8.type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_2f8.type.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          if (local_390.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_390.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask);
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&local_198);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)local_288);
          goto LAB_01623d16;
        }
      }
      else {
        if (PVar1 != ARRAY) {
          this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_498 = (undefined1  [8])&LStack_490.type_info_;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_498,"Unimplemented type for DISTINCT","");
          NotImplementedException::NotImplementedException(this_01,(string *)local_498);
          __cxa_throw(this_01,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_3b8 = (optional_ptr<duckdb::ValidityMask,_true>)
                    (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
        if (uVar50 != 0) {
          iVar35 = ArrayType::GetSize(&local_100.type);
          SelectionVector::SelectionVector(&local_390,uVar50);
          SelectionVector::SelectionVector(&local_360,uVar50);
          pVVar24 = ArrayVector::GetEntry(&local_100);
          Vector::Vector((Vector *)local_498,pVVar24);
          pVVar24 = ArrayVector::GetEntry(&local_98);
          Vector::Vector((Vector *)local_428,pVVar24);
          iVar60 = ArrayVector::GetTotalSize(&local_100);
          Vector::Flatten((Vector *)local_498,iVar60);
          iVar60 = ArrayVector::GetTotalSize(&local_98);
          Vector::Flatten((Vector *)local_428,iVar60);
          Vector::Vector(&local_2f8,(Vector *)local_498,&local_390,uVar50);
          Vector::Vector((Vector *)local_288,(Vector *)local_428,&local_360,uVar50);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_198);
          Vector::ToUnifiedFormat(&local_100,uVar50,&local_198);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_200);
          Vector::ToUnifiedFormat(&local_98,uVar50,&local_200);
          SelectionVector::SelectionVector(&local_3a8,uVar50);
          auVar16 = _DAT_01d84390;
          lVar47 = uVar50 - 1;
          auVar70._8_4_ = (int)lVar47;
          auVar70._0_8_ = lVar47;
          auVar70._12_4_ = (int)((ulong)lVar47 >> 0x20);
          uVar33 = 0;
          auVar70 = auVar70 ^ _DAT_01d84390;
          auVar73 = _DAT_01d84380;
          do {
            auVar74 = auVar73 ^ auVar16;
            if ((bool)(~(auVar74._4_4_ == auVar70._4_4_ && auVar70._0_4_ < auVar74._0_4_ ||
                        auVar70._4_4_ < auVar74._4_4_) & 1)) {
              local_3a8.sel_vector[uVar33] = (sel_t)uVar33;
            }
            if ((auVar74._12_4_ != auVar70._12_4_ || auVar74._8_4_ <= auVar70._8_4_) &&
                auVar74._12_4_ <= auVar70._12_4_) {
              local_3a8.sel_vector[uVar33 + 1] = (sel_t)uVar33 + 1;
            }
            uVar33 = uVar33 + 2;
            lVar47 = auVar73._8_8_;
            auVar73._0_8_ = auVar73._0_8_ + 2;
            auVar73._8_8_ = lVar47 + 2;
          } while ((uVar50 + 1 & 0xfffffffffffffffe) != uVar33);
          SelectionVector::SelectionVector(&local_310,uVar50);
          SelectionVector::SelectionVector((SelectionVector *)(local_348 + 0x20),uVar50);
          local_348._0_16_ = (undefined1  [16])0x0;
          local_348._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_348._24_8_ = (element_type *)0x800;
          if (local_3b8.ptr == (ValidityMask *)0x0) {
            local_4b8.ptr = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3b8);
            peVar25 = (element_type *)ValidityMask::Capacity(local_3b8.ptr);
            uVar17 = local_348._16_8_;
            local_348._0_16_ = (undefined1  [16])0x0;
            local_348._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17);
            }
            local_4b8.ptr = (ValidityMask *)local_348;
            local_348._24_8_ = peVar25;
          }
          iVar60 = 0;
          local_4c8 = 0;
          do {
            pSVar21 = local_150.sel;
            psVar13 = (local_198.sel)->sel_vector;
            uVar33 = 0;
            do {
              uVar62 = uVar33;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar62 = (ulong)local_3a8.sel_vector[uVar33];
              }
              if (psVar13 != (sel_t *)0x0) {
                uVar62 = (ulong)psVar13[uVar62];
              }
              iVar56 = (int)iVar35;
              iVar38 = (int)iVar60;
              local_390.sel_vector[uVar33] = (int)uVar62 * iVar56 + iVar38;
              uVar33 = uVar33 + 1;
            } while (uVar50 != uVar33);
            puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                     validity_mask;
            uVar33 = 0;
            do {
              uVar62 = uVar33;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar62 = (ulong)local_3a8.sel_vector[uVar33];
              }
              if (puVar2 != (unsigned_long *)0x0) {
                uVar62 = (ulong)*(uint *)((long)puVar2 + uVar62 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_360.sel_vector)->
                              validity_mask + uVar33 * 4) = (int)uVar62 * iVar56 + iVar38;
              uVar33 = uVar33 + 1;
            } while (uVar50 != uVar33);
            uVar33 = 0;
            uVar62 = 0;
            lVar47 = 0;
            do {
              uVar61 = uVar33;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar61 = (ulong)local_3a8.sel_vector[uVar33];
              }
              if (iVar35 == iVar60) {
                if ((SelectionVector *)local_378.sel_vector != (SelectionVector *)0x0) {
                  uVar61 = (ulong)*(uint *)((long)(sel_t **)local_378.sel_vector + uVar61 * 4);
                }
                if ((OptionalSelection *)local_1b8.sel != (OptionalSelection *)0x0) {
                  *(int *)((long)&((SelectionVector *)(local_1b8.sel)->sel_vector)->sel_vector +
                          lVar47 * 4) = (int)uVar61;
                }
                lVar47 = lVar47 + 1;
              }
              else {
                *(sel_t *)((long)&(((AllocatedData *)local_310.sel_vector)->allocator).ptr +
                          uVar62 * 4) = (sel_t)uVar61;
                uVar62 = uVar62 + 1;
              }
              uVar33 = uVar33 + 1;
            } while (uVar50 != uVar33);
            if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
              pSVar4 = (SelectionVector *)(local_150.sel)->sel_vector;
              p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (((SelectionVector *)&(local_150.sel)->selection_data)->selection_data).
                        internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              ((local_150.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              ((local_150.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
              }
              pSVar21->sel_vector = (sel_t *)pSVar4;
            }
            pSVar21 = local_1b8.sel;
            if ((OptionalSelection *)local_1b8.sel != (OptionalSelection *)0x0) {
              pSVar4 = (SelectionVector *)(local_1b8.sel)->sel_vector;
              p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (((SelectionVector *)&(local_1b8.sel)->selection_data)->selection_data).
                        internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              ((local_1b8.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              ((local_1b8.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
              }
              pSVar21->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + lVar47 * 4);
            }
            if (uVar62 < uVar50) {
              if (uVar62 == 0) {
                uVar50 = 0;
              }
              else {
                uVar50 = 0;
                do {
                  sVar46 = (sel_t)uVar50;
                  if ((element_type *)local_310.sel_vector != (element_type *)0x0) {
                    sVar46 = *(sel_t *)((long)&(((AllocatedData *)local_310.sel_vector)->allocator).
                                               ptr + uVar50 * 4);
                  }
                  local_3a8.sel_vector[uVar50] = sVar46;
                  uVar50 = uVar50 + 1;
                } while (uVar62 != uVar50);
                psVar13 = (local_198.sel)->sel_vector;
                uVar50 = 0;
                do {
                  uVar33 = uVar50;
                  if (local_3a8.sel_vector != (sel_t *)0x0) {
                    uVar33 = (ulong)local_3a8.sel_vector[uVar50];
                  }
                  if (psVar13 != (sel_t *)0x0) {
                    uVar33 = (ulong)psVar13[uVar33];
                  }
                  local_390.sel_vector[uVar50] = (int)uVar33 * iVar56 + iVar38;
                  uVar50 = uVar50 + 1;
                } while (uVar62 != uVar50);
                puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                         validity_mask;
                uVar33 = 0;
                do {
                  uVar50 = uVar33;
                  if (local_3a8.sel_vector != (sel_t *)0x0) {
                    uVar50 = (ulong)local_3a8.sel_vector[uVar33];
                  }
                  if (puVar2 != (unsigned_long *)0x0) {
                    uVar50 = (ulong)*(uint *)((long)puVar2 + uVar50 * 4);
                  }
                  *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_360.sel_vector)->
                                  validity_mask + uVar33 * 4) = (int)uVar50 * iVar56 + iVar38;
                  uVar33 = uVar33 + 1;
                  uVar50 = uVar62;
                } while (uVar62 != uVar33);
              }
            }
            iVar49 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                               (&local_2f8,(Vector *)local_288,&local_3a8,uVar50,&local_310,
                                (SelectionVector *)(local_348 + 0x20),local_4b8);
            ExtractNestedMask(&local_3a8,uVar50,&local_378,local_4b8.ptr,local_3b8);
            if (iVar49 != 0) {
              oVar30.ptr = &local_310;
              if (uVar50 == iVar49) {
                oVar30.ptr = &local_3a8;
              }
              ExtractNestedSelection
                        ((SelectionVector *)(oVar30.ptr)->sel_vector,iVar49,
                         (SelectionVector *)local_378.sel_vector,(OptionalSelection *)local_150.sel)
              ;
              local_4c8 = local_4c8 + iVar49;
              uVar50 = uVar50 - iVar49;
              if (uVar50 == 0) {
                uVar50 = 0;
              }
              else {
                uVar33 = 0;
                do {
                  sVar46 = (sel_t)uVar33;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._32_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    sVar46 = *(sel_t *)((long)(_func_int ***)local_348._32_8_ + uVar33 * 4);
                  }
                  local_3a8.sel_vector[uVar33] = sVar46;
                  uVar33 = uVar33 + 1;
                } while (uVar50 != uVar33);
                psVar13 = (local_198.sel)->sel_vector;
                uVar33 = 0;
                do {
                  uVar62 = uVar33;
                  if (local_3a8.sel_vector != (sel_t *)0x0) {
                    uVar62 = (ulong)local_3a8.sel_vector[uVar33];
                  }
                  if (psVar13 != (sel_t *)0x0) {
                    uVar62 = (ulong)psVar13[uVar62];
                  }
                  local_390.sel_vector[uVar33] = (int)uVar62 * iVar56 + iVar38;
                  uVar33 = uVar33 + 1;
                } while (uVar50 != uVar33);
                puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                         validity_mask;
                uVar33 = 0;
                do {
                  uVar62 = uVar33;
                  if (local_3a8.sel_vector != (sel_t *)0x0) {
                    uVar62 = (ulong)local_3a8.sel_vector[uVar33];
                  }
                  if (puVar2 != (unsigned_long *)0x0) {
                    uVar62 = (ulong)*(uint *)((long)puVar2 + uVar62 * 4);
                  }
                  *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_360.sel_vector)->
                                  validity_mask + uVar33 * 4) = (int)uVar62 * iVar56 + iVar38;
                  uVar33 = uVar33 + 1;
                } while (uVar50 != uVar33);
              }
            }
            iVar49 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                               (&local_2f8,(Vector *)local_288,&local_3a8,uVar50,
                                (SelectionVector *)(local_348 + 0x20),&local_310,local_3b8);
            ExtractNestedMask(&local_3a8,uVar50,&local_378,local_4b8.ptr,local_3b8);
            uVar50 = uVar50 - iVar49;
            oVar31.ptr = (SelectionVector *)(local_348 + 0x20);
            if (uVar50 == 0) {
              oVar31.ptr = &local_3a8;
            }
            ExtractNestedSelection
                      ((SelectionVector *)(oVar31.ptr)->sel_vector,iVar49,
                       (SelectionVector *)local_378.sel_vector,(OptionalSelection *)local_1b8.sel);
            if (iVar49 != 0) {
              if (uVar50 == 0) break;
              uVar33 = 0;
              do {
                uVar62 = uVar33;
                if ((element_type *)local_310.sel_vector != (element_type *)0x0) {
                  uVar62 = (ulong)*(uint *)((long)&(((AllocatedData *)local_310.sel_vector)->
                                                   allocator).ptr + uVar33 * 4);
                }
                local_3a8.sel_vector[uVar33] = (sel_t)uVar62;
                uVar33 = uVar33 + 1;
              } while (uVar50 != uVar33);
            }
            iVar60 = iVar60 + 1;
          } while (uVar50 != 0);
          goto LAB_01623b54;
        }
      }
LAB_0161f7d5:
      local_4c8 = 0;
    }
LAB_01623d16:
    local_4c8 = local_4c8 + local_4a0;
    if ((local_210.ptr != (SelectionVector *)0x0) &&
       (optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_210), local_4c8 != 0)) {
      psVar13 = (local_210.ptr)->sel_vector;
      iVar35 = 0;
      do {
        sVar46 = (sel_t)iVar35;
        if (local_118.sel_vector != (sel_t *)0x0) {
          sVar46 = local_118.sel_vector[iVar35];
        }
        psVar13[iVar35] = sVar46;
        iVar35 = iVar35 + 1;
      } while (local_4c8 != iVar35);
    }
    if (local_218.ptr != (SelectionVector *)0x0) {
      optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_218);
      if (count != local_4c8) {
        psVar13 = (local_218.ptr)->sel_vector;
        lVar47 = 0;
        do {
          sVar46 = (sel_t)lVar47;
          if (local_130.sel_vector != (sel_t *)0x0) {
            sVar46 = local_130.sel_vector[lVar47];
          }
          psVar13[lVar47] = sVar46;
          lVar47 = lVar47 + 1;
        } while (count - local_4c8 != lVar47);
      }
    }
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_98.type);
    if (local_100.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_100.type);
    if (local_378.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_378.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_1b8.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_130.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_150.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    goto LAB_0162d022;
  }
LAB_0162aa67:
  if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  local_118.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_478._M_pi;
  if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
    local_118.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_478._M_pi;
  }
LAB_0162d022:
  if ((element_type *)
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return local_4c8;
}

Assistant:

static idx_t TemplatedDistinctSelectOperation(Vector &left, Vector &right, optional_ptr<const SelectionVector> sel,
                                              idx_t count, optional_ptr<SelectionVector> true_sel,
                                              optional_ptr<SelectionVector> false_sel,
                                              optional_ptr<ValidityMask> null_mask) {

	switch (left.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return DistinctSelect<int8_t, int8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INT16:
		return DistinctSelect<int16_t, int16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT32:
		return DistinctSelect<int32_t, int32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT64:
		return DistinctSelect<int64_t, int64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT8:
		return DistinctSelect<uint8_t, uint8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT16:
		return DistinctSelect<uint16_t, uint16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT32:
		return DistinctSelect<uint32_t, uint32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT64:
		return DistinctSelect<uint64_t, uint64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::INT128:
		return DistinctSelect<hugeint_t, hugeint_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                                null_mask);
	case PhysicalType::UINT128:
		return DistinctSelect<uhugeint_t, uhugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::FLOAT:
		return DistinctSelect<float, float, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                        null_mask);
	case PhysicalType::DOUBLE:
		return DistinctSelect<double, double, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INTERVAL:
		return DistinctSelect<interval_t, interval_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::VARCHAR:
		return DistinctSelect<string_t, string_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return DistinctSelectNested<OP>(left, right, sel, count, true_sel, false_sel, null_mask);
	default:
		throw InternalException("Invalid type for distinct selection");
	}
}